

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx512::CurveNvIntersectorK<8,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  Primitive PVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCRayQueryContext *pRVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  byte bVar70;
  byte bVar71;
  byte bVar72;
  ulong uVar73;
  ulong uVar74;
  byte bVar75;
  byte bVar76;
  Primitive *pPVar77;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  uint uVar78;
  int iVar79;
  byte bVar80;
  long lVar81;
  ulong uVar82;
  uint uVar83;
  uint uVar84;
  uint uVar148;
  uint uVar149;
  uint uVar151;
  uint uVar152;
  uint uVar153;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  uint uVar150;
  uint uVar154;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float pp;
  float fVar155;
  float fVar156;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar172;
  float fVar173;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar163 [32];
  float fVar174;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar178;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar179 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar194;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar215;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar234;
  float fVar243;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar241;
  float fVar242;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar247;
  undefined1 auVar246 [64];
  undefined1 auVar248 [32];
  undefined1 auVar251 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar252 [64];
  float fVar253;
  float fVar260;
  undefined1 auVar256 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar258;
  float fVar259;
  undefined1 auVar257 [64];
  undefined1 auVar261 [16];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  float fVar265;
  undefined1 auVar264 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [64];
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_970;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined1 local_840 [16];
  undefined1 (*local_828) [32];
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  Primitive *local_698;
  Primitive *local_690;
  ulong local_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 auStack_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  RTCHitN local_4a0 [32];
  undefined1 local_480 [32];
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar2 = prim[1];
  uVar74 = (ulong)(byte)PVar2;
  lVar81 = uVar74 * 0x19;
  fVar253 = *(float *)(prim + lVar81 + 0x12);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar89 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar90 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + lVar81 + 6));
  fVar215 = fVar253 * auVar90._0_4_;
  fVar155 = fVar253 * auVar89._0_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar74 * 4 + 6);
  auVar103 = vpmovsxbd_avx2(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar74 * 5 + 6);
  auVar101 = vpmovsxbd_avx2(auVar16);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar74 * 6 + 6);
  auVar104 = vpmovsxbd_avx2(auVar87);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar74 * 0xb + 6);
  auVar105 = vpmovsxbd_avx2(auVar92);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar110 = vpmovsxbd_avx2(auVar85);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar106 = vcvtdq2ps_avx(auVar110);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar74 + 6);
  auVar102 = vpmovsxbd_avx2(auVar97);
  auVar102 = vcvtdq2ps_avx(auVar102);
  uVar73 = (ulong)(uint)((int)(uVar74 * 9) * 2);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar107 = vpmovsxbd_avx2(auVar93);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar73 + uVar74 + 6);
  auVar108 = vpmovsxbd_avx2(auVar86);
  auVar108 = vcvtdq2ps_avx(auVar108);
  uVar82 = (ulong)(uint)((int)(uVar74 * 5) << 2);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar82 + 6);
  auVar100 = vpmovsxbd_avx2(auVar88);
  auVar109 = vcvtdq2ps_avx(auVar100);
  auVar120._4_4_ = fVar155;
  auVar120._0_4_ = fVar155;
  auVar120._8_4_ = fVar155;
  auVar120._12_4_ = fVar155;
  auVar120._16_4_ = fVar155;
  auVar120._20_4_ = fVar155;
  auVar120._24_4_ = fVar155;
  auVar120._28_4_ = fVar155;
  auVar122._8_4_ = 1;
  auVar122._0_8_ = 0x100000001;
  auVar122._12_4_ = 1;
  auVar122._16_4_ = 1;
  auVar122._20_4_ = 1;
  auVar122._24_4_ = 1;
  auVar122._28_4_ = 1;
  auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar112 = ZEXT1632(CONCAT412(fVar253 * auVar89._12_4_,
                                CONCAT48(fVar253 * auVar89._8_4_,
                                         CONCAT44(fVar253 * auVar89._4_4_,fVar155))));
  auVar111 = vpermps_avx2(auVar122,auVar112);
  auVar99 = vpermps_avx512vl(auVar98,auVar112);
  fVar155 = auVar99._0_4_;
  fVar258 = auVar99._4_4_;
  auVar112._4_4_ = fVar258 * auVar104._4_4_;
  auVar112._0_4_ = fVar155 * auVar104._0_4_;
  fVar259 = auVar99._8_4_;
  auVar112._8_4_ = fVar259 * auVar104._8_4_;
  fVar260 = auVar99._12_4_;
  auVar112._12_4_ = fVar260 * auVar104._12_4_;
  fVar231 = auVar99._16_4_;
  auVar112._16_4_ = fVar231 * auVar104._16_4_;
  fVar232 = auVar99._20_4_;
  auVar112._20_4_ = fVar232 * auVar104._20_4_;
  fVar233 = auVar99._24_4_;
  auVar112._24_4_ = fVar233 * auVar104._24_4_;
  auVar112._28_4_ = auVar110._28_4_;
  auVar110._4_4_ = auVar102._4_4_ * fVar258;
  auVar110._0_4_ = auVar102._0_4_ * fVar155;
  auVar110._8_4_ = auVar102._8_4_ * fVar259;
  auVar110._12_4_ = auVar102._12_4_ * fVar260;
  auVar110._16_4_ = auVar102._16_4_ * fVar231;
  auVar110._20_4_ = auVar102._20_4_ * fVar232;
  auVar110._24_4_ = auVar102._24_4_ * fVar233;
  auVar110._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar109._4_4_ * fVar258;
  auVar100._0_4_ = auVar109._0_4_ * fVar155;
  auVar100._8_4_ = auVar109._8_4_ * fVar259;
  auVar100._12_4_ = auVar109._12_4_ * fVar260;
  auVar100._16_4_ = auVar109._16_4_ * fVar231;
  auVar100._20_4_ = auVar109._20_4_ * fVar232;
  auVar100._24_4_ = auVar109._24_4_ * fVar233;
  auVar100._28_4_ = auVar99._28_4_;
  auVar15 = vfmadd231ps_fma(auVar112,auVar111,auVar101);
  auVar16 = vfmadd231ps_fma(auVar110,auVar111,auVar106);
  auVar87 = vfmadd231ps_fma(auVar100,auVar108,auVar111);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar120,auVar103);
  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar120,auVar105);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar107,auVar120);
  auVar121._4_4_ = fVar215;
  auVar121._0_4_ = fVar215;
  auVar121._8_4_ = fVar215;
  auVar121._12_4_ = fVar215;
  auVar121._16_4_ = fVar215;
  auVar121._20_4_ = fVar215;
  auVar121._24_4_ = fVar215;
  auVar121._28_4_ = fVar215;
  auVar100 = ZEXT1632(CONCAT412(fVar253 * auVar90._12_4_,
                                CONCAT48(fVar253 * auVar90._8_4_,
                                         CONCAT44(fVar253 * auVar90._4_4_,fVar215))));
  auVar110 = vpermps_avx2(auVar122,auVar100);
  auVar100 = vpermps_avx512vl(auVar98,auVar100);
  fVar253 = auVar100._0_4_;
  fVar155 = auVar100._4_4_;
  auVar111._4_4_ = fVar155 * auVar104._4_4_;
  auVar111._0_4_ = fVar253 * auVar104._0_4_;
  fVar258 = auVar100._8_4_;
  auVar111._8_4_ = fVar258 * auVar104._8_4_;
  fVar259 = auVar100._12_4_;
  auVar111._12_4_ = fVar259 * auVar104._12_4_;
  fVar260 = auVar100._16_4_;
  auVar111._16_4_ = fVar260 * auVar104._16_4_;
  fVar231 = auVar100._20_4_;
  auVar111._20_4_ = fVar231 * auVar104._20_4_;
  fVar232 = auVar100._24_4_;
  auVar111._24_4_ = fVar232 * auVar104._24_4_;
  auVar111._28_4_ = 1;
  auVar98._4_4_ = auVar102._4_4_ * fVar155;
  auVar98._0_4_ = auVar102._0_4_ * fVar253;
  auVar98._8_4_ = auVar102._8_4_ * fVar258;
  auVar98._12_4_ = auVar102._12_4_ * fVar259;
  auVar98._16_4_ = auVar102._16_4_ * fVar260;
  auVar98._20_4_ = auVar102._20_4_ * fVar231;
  auVar98._24_4_ = auVar102._24_4_ * fVar232;
  auVar98._28_4_ = auVar104._28_4_;
  auVar102._4_4_ = auVar109._4_4_ * fVar155;
  auVar102._0_4_ = auVar109._0_4_ * fVar253;
  auVar102._8_4_ = auVar109._8_4_ * fVar258;
  auVar102._12_4_ = auVar109._12_4_ * fVar259;
  auVar102._16_4_ = auVar109._16_4_ * fVar260;
  auVar102._20_4_ = auVar109._20_4_ * fVar231;
  auVar102._24_4_ = auVar109._24_4_ * fVar232;
  auVar102._28_4_ = auVar100._28_4_;
  auVar92 = vfmadd231ps_fma(auVar111,auVar110,auVar101);
  auVar85 = vfmadd231ps_fma(auVar98,auVar110,auVar106);
  auVar97 = vfmadd231ps_fma(auVar102,auVar110,auVar108);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar121,auVar103);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar121,auVar105);
  auVar117._8_4_ = 0x7fffffff;
  auVar117._0_8_ = 0x7fffffff7fffffff;
  auVar117._12_4_ = 0x7fffffff;
  auVar117._16_4_ = 0x7fffffff;
  auVar117._20_4_ = 0x7fffffff;
  auVar117._24_4_ = 0x7fffffff;
  auVar117._28_4_ = 0x7fffffff;
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar121,auVar107);
  auVar103 = vandps_avx(ZEXT1632(auVar15),auVar117);
  auVar119._8_4_ = 0x219392ef;
  auVar119._0_8_ = 0x219392ef219392ef;
  auVar119._12_4_ = 0x219392ef;
  auVar119._16_4_ = 0x219392ef;
  auVar119._20_4_ = 0x219392ef;
  auVar119._24_4_ = 0x219392ef;
  auVar119._28_4_ = 0x219392ef;
  uVar73 = vcmpps_avx512vl(auVar103,auVar119,1);
  bVar7 = (bool)((byte)uVar73 & 1);
  auVar99._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar15._0_4_;
  bVar7 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar15._4_4_;
  bVar7 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar15._8_4_;
  bVar7 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar15._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar73 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(ZEXT1632(auVar16),auVar117);
  uVar73 = vcmpps_avx512vl(auVar103,auVar119,1);
  bVar7 = (bool)((byte)uVar73 & 1);
  auVar113._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar16._0_4_;
  bVar7 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar113._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar16._4_4_;
  bVar7 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar113._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar16._8_4_;
  bVar7 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar113._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar16._12_4_;
  auVar113._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * 0x219392ef;
  auVar113._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * 0x219392ef;
  auVar113._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * 0x219392ef;
  auVar113._28_4_ = (uint)(byte)(uVar73 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(ZEXT1632(auVar87),auVar117);
  uVar73 = vcmpps_avx512vl(auVar103,auVar119,1);
  bVar7 = (bool)((byte)uVar73 & 1);
  auVar103._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar87._0_4_;
  bVar7 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar87._4_4_;
  bVar7 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar87._8_4_;
  bVar7 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * auVar87._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar73 >> 7) * 0x219392ef;
  auVar101 = vrcp14ps_avx512vl(auVar99);
  auVar118._8_4_ = 0x3f800000;
  auVar118._0_8_ = 0x3f8000003f800000;
  auVar118._12_4_ = 0x3f800000;
  auVar118._16_4_ = 0x3f800000;
  auVar118._20_4_ = 0x3f800000;
  auVar118._24_4_ = 0x3f800000;
  auVar118._28_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar99,auVar101,auVar118);
  auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar101,auVar101);
  auVar101 = vrcp14ps_avx512vl(auVar113);
  auVar16 = vfnmadd213ps_fma(auVar113,auVar101,auVar118);
  auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar101,auVar101);
  auVar101 = vrcp14ps_avx512vl(auVar103);
  auVar87 = vfnmadd213ps_fma(auVar103,auVar101,auVar118);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar101,auVar101);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 7 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar92));
  auVar107._4_4_ = auVar15._4_4_ * auVar103._4_4_;
  auVar107._0_4_ = auVar15._0_4_ * auVar103._0_4_;
  auVar107._8_4_ = auVar15._8_4_ * auVar103._8_4_;
  auVar107._12_4_ = auVar15._12_4_ * auVar103._12_4_;
  auVar107._16_4_ = auVar103._16_4_ * 0.0;
  auVar107._20_4_ = auVar103._20_4_ * 0.0;
  auVar107._24_4_ = auVar103._24_4_ * 0.0;
  auVar107._28_4_ = auVar103._28_4_;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 9 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar92));
  auVar102 = vpbroadcastd_avx512vl();
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar116._0_4_ = auVar15._0_4_ * auVar103._0_4_;
  auVar116._4_4_ = auVar15._4_4_ * auVar103._4_4_;
  auVar116._8_4_ = auVar15._8_4_ * auVar103._8_4_;
  auVar116._12_4_ = auVar15._12_4_ * auVar103._12_4_;
  auVar116._16_4_ = auVar103._16_4_ * 0.0;
  auVar116._20_4_ = auVar103._20_4_ * 0.0;
  auVar116._24_4_ = auVar103._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar2 * 0x10 + uVar74 * -2 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar85));
  auVar108._4_4_ = auVar16._4_4_ * auVar103._4_4_;
  auVar108._0_4_ = auVar16._0_4_ * auVar103._0_4_;
  auVar108._8_4_ = auVar16._8_4_ * auVar103._8_4_;
  auVar108._12_4_ = auVar16._12_4_ * auVar103._12_4_;
  auVar108._16_4_ = auVar103._16_4_ * 0.0;
  auVar108._20_4_ = auVar103._20_4_ * 0.0;
  auVar108._24_4_ = auVar103._24_4_ * 0.0;
  auVar108._28_4_ = auVar103._28_4_;
  auVar103 = vcvtdq2ps_avx(auVar101);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar85));
  auVar115._0_4_ = auVar16._0_4_ * auVar103._0_4_;
  auVar115._4_4_ = auVar16._4_4_ * auVar103._4_4_;
  auVar115._8_4_ = auVar16._8_4_ * auVar103._8_4_;
  auVar115._12_4_ = auVar16._12_4_ * auVar103._12_4_;
  auVar115._16_4_ = auVar103._16_4_ * 0.0;
  auVar115._20_4_ = auVar103._20_4_ * 0.0;
  auVar115._24_4_ = auVar103._24_4_ * 0.0;
  auVar115._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 + uVar74 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar97));
  auVar109._4_4_ = auVar103._4_4_ * auVar87._4_4_;
  auVar109._0_4_ = auVar103._0_4_ * auVar87._0_4_;
  auVar109._8_4_ = auVar103._8_4_ * auVar87._8_4_;
  auVar109._12_4_ = auVar103._12_4_ * auVar87._12_4_;
  auVar109._16_4_ = auVar103._16_4_ * 0.0;
  auVar109._20_4_ = auVar103._20_4_ * 0.0;
  auVar109._24_4_ = auVar103._24_4_ * 0.0;
  auVar109._28_4_ = auVar103._28_4_;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0x17 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar97));
  auVar114._0_4_ = auVar87._0_4_ * auVar103._0_4_;
  auVar114._4_4_ = auVar87._4_4_ * auVar103._4_4_;
  auVar114._8_4_ = auVar87._8_4_ * auVar103._8_4_;
  auVar114._12_4_ = auVar87._12_4_ * auVar103._12_4_;
  auVar114._16_4_ = auVar103._16_4_ * 0.0;
  auVar114._20_4_ = auVar103._20_4_ * 0.0;
  auVar114._24_4_ = auVar103._24_4_ * 0.0;
  auVar114._28_4_ = 0;
  auVar103 = vpminsd_avx2(auVar107,auVar116);
  auVar101 = vpminsd_avx2(auVar108,auVar115);
  auVar103 = vmaxps_avx(auVar103,auVar101);
  auVar101 = vpminsd_avx2(auVar109,auVar114);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar104._4_4_ = uVar1;
  auVar104._0_4_ = uVar1;
  auVar104._8_4_ = uVar1;
  auVar104._12_4_ = uVar1;
  auVar104._16_4_ = uVar1;
  auVar104._20_4_ = uVar1;
  auVar104._24_4_ = uVar1;
  auVar104._28_4_ = uVar1;
  auVar101 = vmaxps_avx512vl(auVar101,auVar104);
  auVar103 = vmaxps_avx(auVar103,auVar101);
  auVar101._8_4_ = 0x3f7ffffa;
  auVar101._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar101._12_4_ = 0x3f7ffffa;
  auVar101._16_4_ = 0x3f7ffffa;
  auVar101._20_4_ = 0x3f7ffffa;
  auVar101._24_4_ = 0x3f7ffffa;
  auVar101._28_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar103,auVar101);
  auVar103 = vpmaxsd_avx2(auVar107,auVar116);
  auVar101 = vpmaxsd_avx2(auVar108,auVar115);
  auVar103 = vminps_avx(auVar103,auVar101);
  auVar101 = vpmaxsd_avx2(auVar109,auVar114);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar105._4_4_ = uVar1;
  auVar105._0_4_ = uVar1;
  auVar105._8_4_ = uVar1;
  auVar105._12_4_ = uVar1;
  auVar105._16_4_ = uVar1;
  auVar105._20_4_ = uVar1;
  auVar105._24_4_ = uVar1;
  auVar105._28_4_ = uVar1;
  auVar101 = vminps_avx512vl(auVar101,auVar105);
  auVar103 = vminps_avx(auVar103,auVar101);
  auVar106._8_4_ = 0x3f800003;
  auVar106._0_8_ = 0x3f8000033f800003;
  auVar106._12_4_ = 0x3f800003;
  auVar106._16_4_ = 0x3f800003;
  auVar106._20_4_ = 0x3f800003;
  auVar106._24_4_ = 0x3f800003;
  auVar106._28_4_ = 0x3f800003;
  auVar103 = vmulps_avx512vl(auVar103,auVar106);
  uVar18 = vpcmpgtd_avx512vl(auVar102,_DAT_01fe9900);
  uVar17 = vcmpps_avx512vl(local_300,auVar103,2);
  if ((byte)((byte)uVar17 & (byte)uVar18) == 0) {
    return;
  }
  local_688 = (ulong)(byte)((byte)uVar17 & (byte)uVar18);
  pPVar77 = prim + lVar81 + 0x16;
  local_828 = (undefined1 (*) [32])&local_3c0;
  local_520 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_698 = pPVar77;
  local_690 = prim;
LAB_01ca98b7:
  lVar81 = 0;
  for (uVar73 = local_688; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
    lVar81 = lVar81 + 1;
  }
  local_688 = local_688 - 1 & local_688;
  uVar1 = *(undefined4 *)(prim + lVar81 * 4 + 6);
  uVar73 = (ulong)(uint)((int)lVar81 << 6);
  auVar15 = *(undefined1 (*) [16])(pPVar77 + uVar73);
  if (local_688 != 0) {
    uVar74 = local_688 - 1 & local_688;
    for (uVar82 = local_688; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
    }
    if (uVar74 != 0) {
      for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar16 = *(undefined1 (*) [16])(pPVar77 + uVar73 + 0x10);
  auVar87 = *(undefined1 (*) [16])(pPVar77 + uVar73 + 0x20);
  auVar92 = *(undefined1 (*) [16])(pPVar77 + uVar73 + 0x30);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar97 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar178 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar91._4_4_ = uVar178;
  auVar91._0_4_ = uVar178;
  auVar91._8_4_ = uVar178;
  auVar91._12_4_ = uVar178;
  local_5a0._16_4_ = uVar178;
  local_5a0._0_16_ = auVar91;
  local_5a0._20_4_ = uVar178;
  local_5a0._24_4_ = uVar178;
  local_5a0._28_4_ = uVar178;
  auVar269 = ZEXT3264(local_5a0);
  uVar178 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar96._4_4_ = uVar178;
  auVar96._0_4_ = uVar178;
  auVar96._8_4_ = uVar178;
  auVar96._12_4_ = uVar178;
  local_5c0._16_4_ = uVar178;
  local_5c0._0_16_ = auVar96;
  local_5c0._20_4_ = uVar178;
  local_5c0._24_4_ = uVar178;
  local_5c0._28_4_ = uVar178;
  auVar85 = vunpcklps_avx(auVar91,auVar96);
  fVar253 = *(float *)(ray + k * 4 + 0xc0);
  auVar261._4_4_ = fVar253;
  auVar261._0_4_ = fVar253;
  auVar261._8_4_ = fVar253;
  auVar261._12_4_ = fVar253;
  local_5e0._16_4_ = fVar253;
  local_5e0._0_16_ = auVar261;
  local_5e0._20_4_ = fVar253;
  local_5e0._24_4_ = fVar253;
  local_5e0._28_4_ = fVar253;
  local_7f0 = vinsertps_avx(auVar85,auVar261,0x28);
  auVar262 = ZEXT1664(local_7f0);
  auVar90._0_4_ = auVar15._0_4_ + auVar16._0_4_ + auVar87._0_4_ + auVar92._0_4_;
  auVar90._4_4_ = auVar15._4_4_ + auVar16._4_4_ + auVar87._4_4_ + auVar92._4_4_;
  auVar90._8_4_ = auVar15._8_4_ + auVar16._8_4_ + auVar87._8_4_ + auVar92._8_4_;
  auVar90._12_4_ = auVar15._12_4_ + auVar16._12_4_ + auVar87._12_4_ + auVar92._12_4_;
  auVar89._8_4_ = 0x3e800000;
  auVar89._0_8_ = 0x3e8000003e800000;
  auVar89._12_4_ = 0x3e800000;
  auVar85 = vmulps_avx512vl(auVar90,auVar89);
  auVar85 = vsubps_avx(auVar85,auVar97);
  auVar85 = vdpps_avx(auVar85,local_7f0,0x7f);
  fVar155 = *(float *)(ray + k * 4 + 0x60);
  auVar264 = ZEXT464((uint)fVar155);
  local_800 = vdpps_avx(local_7f0,local_7f0,0x7f);
  auVar266 = ZEXT1664(local_800);
  uVar78 = *(uint *)(prim + 2);
  auVar94._4_12_ = ZEXT812(0) << 0x20;
  auVar94._0_4_ = local_800._0_4_;
  auVar86 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar94);
  auVar93 = vfnmadd213ss_fma(auVar86,local_800,ZEXT416(0x40000000));
  local_2e0 = auVar85._0_4_ * auVar86._0_4_ * auVar93._0_4_;
  auVar246 = ZEXT464((uint)local_2e0);
  auVar95._4_4_ = local_2e0;
  auVar95._0_4_ = local_2e0;
  auVar95._8_4_ = local_2e0;
  auVar95._12_4_ = local_2e0;
  fStack_7d0 = local_2e0;
  _local_7e0 = auVar95;
  fStack_7cc = local_2e0;
  fStack_7c8 = local_2e0;
  fStack_7c4 = local_2e0;
  auVar85 = vfmadd231ps_fma(auVar97,local_7f0,auVar95);
  auVar85 = vblendps_avx(auVar85,ZEXT816(0) << 0x40,8);
  auVar15 = vsubps_avx(auVar15,auVar85);
  auVar87 = vsubps_avx(auVar87,auVar85);
  auVar252 = ZEXT1664(auVar87);
  auVar16 = vsubps_avx(auVar16,auVar85);
  auVar257 = ZEXT1664(auVar16);
  auVar92 = vsubps_avx(auVar92,auVar85);
  auVar103 = vbroadcastss_avx512vl(auVar15);
  auVar124._8_4_ = 1;
  auVar124._0_8_ = 0x100000001;
  auVar124._12_4_ = 1;
  auVar124._16_4_ = 1;
  auVar124._20_4_ = 1;
  auVar124._24_4_ = 1;
  auVar124._28_4_ = 1;
  local_760 = ZEXT1632(auVar15);
  auVar101 = vpermps_avx512vl(auVar124,local_760);
  auVar125._8_4_ = 2;
  auVar125._0_8_ = 0x200000002;
  auVar125._12_4_ = 2;
  auVar125._16_4_ = 2;
  auVar125._20_4_ = 2;
  auVar125._24_4_ = 2;
  auVar125._28_4_ = 2;
  auVar104 = vpermps_avx512vl(auVar125,local_760);
  auVar126._8_4_ = 3;
  auVar126._0_8_ = 0x300000003;
  auVar126._12_4_ = 3;
  auVar126._16_4_ = 3;
  auVar126._20_4_ = 3;
  auVar126._24_4_ = 3;
  auVar126._28_4_ = 3;
  local_8e0 = vpermps_avx512vl(auVar126,local_760);
  auVar271 = ZEXT3264(local_8e0);
  auVar105 = vbroadcastss_avx512vl(auVar16);
  local_7a0 = ZEXT1632(auVar16);
  auVar106 = vpermps_avx512vl(auVar124,local_7a0);
  local_900 = vpermps_avx512vl(auVar125,local_7a0);
  auVar272 = ZEXT3264(local_900);
  auVar102 = vpermps_avx512vl(auVar126,local_7a0);
  local_920 = vbroadcastss_avx512vl(auVar87);
  auVar273 = ZEXT3264(local_920);
  local_780 = ZEXT1632(auVar87);
  auVar107 = vpermps_avx512vl(auVar124,local_780);
  local_940 = vpermps_avx512vl(auVar125,local_780);
  auVar274 = ZEXT3264(local_940);
  auVar108 = vpermps_avx512vl(auVar126,local_780);
  local_260 = vbroadcastss_avx512vl(auVar92);
  _local_7c0 = ZEXT1632(auVar92);
  local_280 = vpermps_avx2(auVar124,_local_7c0);
  local_240 = vpermps_avx512vl(auVar125,_local_7c0);
  local_2c0 = vpermps_avx2(auVar126,_local_7c0);
  auVar15 = vfmadd231ps_fma(ZEXT432((uint)(fVar253 * fVar253)),local_5c0,local_5c0);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),local_5a0,local_5a0);
  local_220._0_4_ = auVar15._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar123._8_4_ = 0x7fffffff;
  auVar123._0_8_ = 0x7fffffff7fffffff;
  auVar123._12_4_ = 0x7fffffff;
  auVar123._16_4_ = 0x7fffffff;
  auVar123._20_4_ = 0x7fffffff;
  auVar123._24_4_ = 0x7fffffff;
  auVar123._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar123);
  local_700 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar155 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_4c0 = vpbroadcastd_avx512vl();
  iVar79 = 1;
  uVar73 = 0;
  local_4e0 = vpbroadcastd_avx512vl();
  auVar15 = vsqrtss_avx(local_800,local_800);
  auVar16 = vsqrtss_avx(local_800,local_800);
  local_530 = ZEXT816(0x3f80000000000000);
  auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar275 = ZEXT3264(auVar109);
  local_2a0 = local_240;
  do {
    auVar87 = vmovshdup_avx(local_530);
    auVar87 = vsubps_avx(auVar87,local_530);
    auVar163._0_4_ = auVar87._0_4_;
    fVar243 = auVar163._0_4_ * 0.04761905;
    uVar178 = local_530._0_4_;
    local_880._4_4_ = uVar178;
    local_880._0_4_ = uVar178;
    local_880._8_4_ = uVar178;
    local_880._12_4_ = uVar178;
    local_880._16_4_ = uVar178;
    local_880._20_4_ = uVar178;
    local_880._24_4_ = uVar178;
    local_880._28_4_ = uVar178;
    auVar163._4_4_ = auVar163._0_4_;
    auVar163._8_4_ = auVar163._0_4_;
    auVar163._12_4_ = auVar163._0_4_;
    auVar163._16_4_ = auVar163._0_4_;
    auVar163._20_4_ = auVar163._0_4_;
    auVar163._24_4_ = auVar163._0_4_;
    auVar163._28_4_ = auVar163._0_4_;
    auVar87 = vfmadd231ps_fma(local_880,auVar163,_DAT_01faff20);
    auVar110 = vsubps_avx512vl(auVar275._0_32_,ZEXT1632(auVar87));
    fVar253 = auVar110._0_4_;
    fVar259 = auVar110._4_4_;
    fVar231 = auVar110._8_4_;
    fVar233 = auVar110._12_4_;
    fVar234 = auVar110._16_4_;
    fVar241 = auVar110._20_4_;
    fVar242 = auVar110._24_4_;
    fVar156 = fVar253 * fVar253 * fVar253;
    fVar172 = fVar259 * fVar259 * fVar259;
    auVar132._4_4_ = fVar172;
    auVar132._0_4_ = fVar156;
    fVar173 = fVar231 * fVar231 * fVar231;
    auVar132._8_4_ = fVar173;
    fVar174 = fVar233 * fVar233 * fVar233;
    auVar132._12_4_ = fVar174;
    fVar175 = fVar234 * fVar234 * fVar234;
    auVar132._16_4_ = fVar175;
    fVar176 = fVar241 * fVar241 * fVar241;
    auVar132._20_4_ = fVar176;
    fVar177 = fVar242 * fVar242 * fVar242;
    auVar132._24_4_ = fVar177;
    auVar132._28_4_ = auVar163._0_4_;
    auVar109 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar100 = vmulps_avx512vl(auVar132,auVar109);
    fVar258 = auVar87._0_4_;
    fVar260 = auVar87._4_4_;
    fVar232 = auVar87._8_4_;
    fVar215 = auVar87._12_4_;
    fVar194 = fVar258 * fVar258 * fVar258;
    fVar212 = fVar260 * fVar260 * fVar260;
    fVar213 = fVar232 * fVar232 * fVar232;
    fVar214 = fVar215 * fVar215 * fVar215;
    auVar69._28_4_ = DAT_01faff20._28_4_;
    auVar69._0_28_ = ZEXT1628(CONCAT412(fVar214,CONCAT48(fVar213,CONCAT44(fVar212,fVar194))));
    auVar263._0_4_ = fVar258 * fVar253;
    auVar263._4_4_ = fVar260 * fVar259;
    auVar263._8_4_ = fVar232 * fVar231;
    auVar263._12_4_ = fVar215 * fVar233;
    auVar263._16_4_ = fVar234 * 0.0;
    auVar263._20_4_ = fVar241 * 0.0;
    auVar263._28_36_ = auVar262._28_36_;
    auVar263._24_4_ = fVar242 * 0.0;
    auVar111 = vmulps_avx512vl(auVar69,auVar109);
    fVar265 = auVar111._28_4_ + auVar163._0_4_;
    fVar247 = fVar265 + auVar266._28_4_ + auVar246._28_4_;
    auVar135._4_4_ = fVar172 * 0.16666667;
    auVar135._0_4_ = fVar156 * 0.16666667;
    auVar135._8_4_ = fVar173 * 0.16666667;
    auVar135._12_4_ = fVar174 * 0.16666667;
    auVar135._16_4_ = fVar175 * 0.16666667;
    auVar135._20_4_ = fVar176 * 0.16666667;
    auVar135._24_4_ = fVar177 * 0.16666667;
    auVar135._28_4_ = fVar265;
    auVar136._4_4_ =
         (auVar263._4_4_ * fVar259 * 12.0 + auVar263._4_4_ * fVar260 * 6.0 +
         fVar212 + auVar100._4_4_) * 0.16666667;
    auVar136._0_4_ =
         (auVar263._0_4_ * fVar253 * 12.0 + auVar263._0_4_ * fVar258 * 6.0 +
         fVar194 + auVar100._0_4_) * 0.16666667;
    auVar136._8_4_ =
         (auVar263._8_4_ * fVar231 * 12.0 + auVar263._8_4_ * fVar232 * 6.0 +
         fVar213 + auVar100._8_4_) * 0.16666667;
    auVar136._12_4_ =
         (auVar263._12_4_ * fVar233 * 12.0 + auVar263._12_4_ * fVar215 * 6.0 +
         fVar214 + auVar100._12_4_) * 0.16666667;
    auVar136._16_4_ =
         (auVar263._16_4_ * fVar234 * 12.0 + auVar263._16_4_ * 0.0 * 6.0 + auVar100._16_4_ + 0.0) *
         0.16666667;
    auVar136._20_4_ =
         (auVar263._20_4_ * fVar241 * 12.0 + auVar263._20_4_ * 0.0 * 6.0 + auVar100._20_4_ + 0.0) *
         0.16666667;
    auVar136._24_4_ =
         (auVar263._24_4_ * fVar242 * 12.0 + auVar263._24_4_ * 0.0 * 6.0 + auVar100._24_4_ + 0.0) *
         0.16666667;
    auVar136._28_4_ = auVar266._28_4_;
    auVar228._4_4_ =
         (auVar111._4_4_ + fVar172 +
         auVar263._4_4_ * fVar260 * 12.0 + auVar263._4_4_ * fVar259 * 6.0) * 0.16666667;
    auVar228._0_4_ =
         (auVar111._0_4_ + fVar156 +
         auVar263._0_4_ * fVar258 * 12.0 + auVar263._0_4_ * fVar253 * 6.0) * 0.16666667;
    auVar228._8_4_ =
         (auVar111._8_4_ + fVar173 +
         auVar263._8_4_ * fVar232 * 12.0 + auVar263._8_4_ * fVar231 * 6.0) * 0.16666667;
    auVar228._12_4_ =
         (auVar111._12_4_ + fVar174 +
         auVar263._12_4_ * fVar215 * 12.0 + auVar263._12_4_ * fVar233 * 6.0) * 0.16666667;
    auVar228._16_4_ =
         (auVar111._16_4_ + fVar175 + auVar263._16_4_ * 0.0 * 12.0 + auVar263._16_4_ * fVar234 * 6.0
         ) * 0.16666667;
    auVar228._20_4_ =
         (auVar111._20_4_ + fVar176 + auVar263._20_4_ * 0.0 * 12.0 + auVar263._20_4_ * fVar241 * 6.0
         ) * 0.16666667;
    auVar228._24_4_ =
         (auVar111._24_4_ + fVar177 + auVar263._24_4_ * 0.0 * 12.0 + auVar263._24_4_ * fVar242 * 6.0
         ) * 0.16666667;
    auVar228._28_4_ = auVar269._28_4_;
    fVar194 = fVar194 * 0.16666667;
    fVar212 = fVar212 * 0.16666667;
    fVar213 = fVar213 * 0.16666667;
    fVar214 = fVar214 * 0.16666667;
    auVar33._28_4_ = fVar247;
    auVar33._0_28_ = ZEXT1628(CONCAT412(fVar214,CONCAT48(fVar213,CONCAT44(fVar212,fVar194))));
    auVar111 = vmulps_avx512vl(local_260,auVar33);
    auVar34._4_4_ = local_280._4_4_ * fVar212;
    auVar34._0_4_ = local_280._0_4_ * fVar194;
    auVar34._8_4_ = local_280._8_4_ * fVar213;
    auVar34._12_4_ = local_280._12_4_ * fVar214;
    auVar34._16_4_ = local_280._16_4_ * 0.0;
    auVar34._20_4_ = local_280._20_4_ * 0.0;
    auVar34._24_4_ = local_280._24_4_ * 0.0;
    auVar34._28_4_ = auVar264._28_4_ + auVar269._28_4_ + DAT_01faff20._28_4_ + auVar100._28_4_;
    auVar100 = vmulps_avx512vl(local_2a0,auVar33);
    auVar35._4_4_ = local_2c0._4_4_ * fVar212;
    auVar35._0_4_ = local_2c0._0_4_ * fVar194;
    auVar35._8_4_ = local_2c0._8_4_ * fVar213;
    auVar35._12_4_ = local_2c0._12_4_ * fVar214;
    auVar35._16_4_ = local_2c0._16_4_ * 0.0;
    auVar35._20_4_ = local_2c0._20_4_ * 0.0;
    auVar35._24_4_ = local_2c0._24_4_ * 0.0;
    auVar35._28_4_ = fVar247;
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar228,auVar273._0_32_);
    auVar112 = vfmadd231ps_avx512vl(auVar34,auVar228,auVar107);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar228,auVar274._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar35,auVar108,auVar228);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar136,auVar105);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar136,auVar106);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar136,auVar272._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar136);
    auVar99 = vfmadd231ps_avx512vl(auVar111,auVar135,auVar103);
    auVar113 = vfmadd231ps_avx512vl(auVar112,auVar135,auVar101);
    auVar114 = vfmadd231ps_avx512vl(auVar100,auVar135,auVar104);
    auVar100 = vfmadd231ps_avx512vl(auVar98,auVar271._0_32_,auVar135);
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar111 = vxorps_avx512vl(auVar110,auVar98);
    auVar112 = vxorps_avx512vl(ZEXT1632(auVar87),auVar98);
    auVar237._0_4_ = auVar112._0_4_ * fVar258;
    auVar237._4_4_ = auVar112._4_4_ * fVar260;
    auVar237._8_4_ = auVar112._8_4_ * fVar232;
    auVar237._12_4_ = auVar112._12_4_ * fVar215;
    auVar237._16_4_ = auVar112._16_4_ * 0.0;
    auVar237._20_4_ = auVar112._20_4_ * 0.0;
    auVar237._24_4_ = auVar112._24_4_ * 0.0;
    auVar237._28_4_ = 0;
    auVar115 = vmulps_avx512vl(auVar263._0_32_,auVar109);
    auVar109 = vsubps_avx(auVar237,auVar115);
    auVar36._4_4_ = auVar111._4_4_ * fVar259 * 0.5;
    auVar36._0_4_ = auVar111._0_4_ * fVar253 * 0.5;
    auVar36._8_4_ = auVar111._8_4_ * fVar231 * 0.5;
    auVar36._12_4_ = auVar111._12_4_ * fVar233 * 0.5;
    auVar36._16_4_ = auVar111._16_4_ * fVar234 * 0.5;
    auVar36._20_4_ = auVar111._20_4_ * fVar241 * 0.5;
    auVar36._24_4_ = auVar111._24_4_ * fVar242 * 0.5;
    auVar36._28_4_ = auVar110._28_4_;
    auVar37._4_4_ = auVar109._4_4_ * 0.5;
    auVar37._0_4_ = auVar109._0_4_ * 0.5;
    auVar37._8_4_ = auVar109._8_4_ * 0.5;
    auVar37._12_4_ = auVar109._12_4_ * 0.5;
    auVar37._16_4_ = auVar109._16_4_ * 0.5;
    auVar37._20_4_ = auVar109._20_4_ * 0.5;
    auVar37._24_4_ = auVar109._24_4_ * 0.5;
    auVar37._28_4_ = auVar109._28_4_;
    auVar38._4_4_ = (auVar115._4_4_ + fVar259 * fVar259) * 0.5;
    auVar38._0_4_ = (auVar115._0_4_ + fVar253 * fVar253) * 0.5;
    auVar38._8_4_ = (auVar115._8_4_ + fVar231 * fVar231) * 0.5;
    auVar38._12_4_ = (auVar115._12_4_ + fVar233 * fVar233) * 0.5;
    auVar38._16_4_ = (auVar115._16_4_ + fVar234 * fVar234) * 0.5;
    auVar38._20_4_ = (auVar115._20_4_ + fVar241 * fVar241) * 0.5;
    auVar38._24_4_ = (auVar115._24_4_ + fVar242 * fVar242) * 0.5;
    auVar38._28_4_ = auVar115._28_4_ + auVar252._28_4_;
    fVar253 = fVar258 * fVar258 * 0.5;
    fVar258 = fVar260 * fVar260 * 0.5;
    fVar259 = fVar232 * fVar232 * 0.5;
    fVar260 = fVar215 * fVar215 * 0.5;
    auVar39._28_4_ = auVar257._28_4_;
    auVar39._0_28_ = ZEXT1628(CONCAT412(fVar260,CONCAT48(fVar259,CONCAT44(fVar258,fVar253))));
    auVar109 = vmulps_avx512vl(local_260,auVar39);
    auVar40._4_4_ = local_280._4_4_ * fVar258;
    auVar40._0_4_ = local_280._0_4_ * fVar253;
    auVar40._8_4_ = local_280._8_4_ * fVar259;
    auVar40._12_4_ = local_280._12_4_ * fVar260;
    auVar40._16_4_ = local_280._16_4_ * 0.0;
    auVar40._20_4_ = local_280._20_4_ * 0.0;
    auVar40._24_4_ = local_280._24_4_ * 0.0;
    auVar40._28_4_ = auVar112._28_4_;
    auVar110 = vmulps_avx512vl(local_2a0,auVar39);
    auVar41._4_4_ = fVar258 * local_2c0._4_4_;
    auVar41._0_4_ = fVar253 * local_2c0._0_4_;
    auVar41._8_4_ = fVar259 * local_2c0._8_4_;
    auVar41._12_4_ = fVar260 * local_2c0._12_4_;
    auVar41._16_4_ = local_2c0._16_4_ * 0.0;
    auVar41._20_4_ = local_2c0._20_4_ * 0.0;
    auVar41._24_4_ = local_2c0._24_4_ * 0.0;
    auVar41._28_4_ = auVar257._28_4_;
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar38,auVar273._0_32_);
    auVar111 = vfmadd231ps_avx512vl(auVar40,auVar38,auVar107);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar38,auVar274._0_32_);
    auVar87 = vfmadd231ps_fma(auVar41,auVar108,auVar38);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar37,auVar105);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar37,auVar106);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar37,auVar272._0_32_);
    auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar102,auVar37);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar36,auVar103);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar36,auVar101);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar36,auVar104);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar271._0_32_,auVar36);
    auVar42._4_4_ = auVar109._4_4_ * fVar243;
    auVar42._0_4_ = auVar109._0_4_ * fVar243;
    auVar42._8_4_ = auVar109._8_4_ * fVar243;
    auVar42._12_4_ = auVar109._12_4_ * fVar243;
    auVar42._16_4_ = auVar109._16_4_ * fVar243;
    auVar42._20_4_ = auVar109._20_4_ * fVar243;
    auVar42._24_4_ = auVar109._24_4_ * fVar243;
    auVar42._28_4_ = auVar108._28_4_;
    auVar269 = ZEXT3264(auVar42);
    auVar43._4_4_ = auVar111._4_4_ * fVar243;
    auVar43._0_4_ = auVar111._0_4_ * fVar243;
    auVar43._8_4_ = auVar111._8_4_ * fVar243;
    auVar43._12_4_ = auVar111._12_4_ * fVar243;
    auVar43._16_4_ = auVar111._16_4_ * fVar243;
    auVar43._20_4_ = auVar111._20_4_ * fVar243;
    auVar43._24_4_ = auVar111._24_4_ * fVar243;
    auVar43._28_4_ = 0x3e2aaaab;
    auVar44._4_4_ = auVar110._4_4_ * fVar243;
    auVar44._0_4_ = auVar110._0_4_ * fVar243;
    auVar44._8_4_ = auVar110._8_4_ * fVar243;
    auVar44._12_4_ = auVar110._12_4_ * fVar243;
    auVar44._16_4_ = auVar110._16_4_ * fVar243;
    auVar44._20_4_ = auVar110._20_4_ * fVar243;
    auVar44._24_4_ = auVar110._24_4_ * fVar243;
    auVar44._28_4_ = 0x40c00000;
    fVar253 = auVar112._0_4_ * fVar243;
    fVar258 = auVar112._4_4_ * fVar243;
    auVar45._4_4_ = fVar258;
    auVar45._0_4_ = fVar253;
    fVar259 = auVar112._8_4_ * fVar243;
    auVar45._8_4_ = fVar259;
    fVar260 = auVar112._12_4_ * fVar243;
    auVar45._12_4_ = fVar260;
    fVar231 = auVar112._16_4_ * fVar243;
    auVar45._16_4_ = fVar231;
    fVar232 = auVar112._20_4_ * fVar243;
    auVar45._20_4_ = fVar232;
    fVar233 = auVar112._24_4_ * fVar243;
    auVar45._24_4_ = fVar233;
    auVar45._28_4_ = fVar243;
    auVar87 = vxorps_avx512vl(auVar275._0_16_,auVar275._0_16_);
    auVar115 = vpermt2ps_avx512vl(auVar99,_DAT_01feed00,ZEXT1632(auVar87));
    auVar262 = ZEXT3264(auVar115);
    auVar116 = vpermt2ps_avx512vl(auVar113,_DAT_01feed00,ZEXT1632(auVar87));
    auVar264 = ZEXT3264(auVar116);
    auVar111 = ZEXT1632(auVar87);
    auVar117 = vpermt2ps_avx512vl(auVar114,_DAT_01feed00,auVar111);
    auVar266 = ZEXT3264(auVar117);
    auVar238._0_4_ = fVar253 + auVar100._0_4_;
    auVar238._4_4_ = fVar258 + auVar100._4_4_;
    auVar238._8_4_ = fVar259 + auVar100._8_4_;
    auVar238._12_4_ = fVar260 + auVar100._12_4_;
    auVar238._16_4_ = fVar231 + auVar100._16_4_;
    auVar238._20_4_ = fVar232 + auVar100._20_4_;
    auVar238._24_4_ = fVar233 + auVar100._24_4_;
    auVar238._28_4_ = fVar243 + auVar100._28_4_;
    auVar109 = vmaxps_avx(auVar100,auVar238);
    auVar110 = vminps_avx(auVar100,auVar238);
    auVar118 = vpermt2ps_avx512vl(auVar100,_DAT_01feed00,auVar111);
    auVar119 = vpermt2ps_avx512vl(auVar42,_DAT_01feed00,auVar111);
    auVar257 = ZEXT3264(auVar119);
    auVar120 = vpermt2ps_avx512vl(auVar43,_DAT_01feed00,auVar111);
    auVar135 = ZEXT1632(auVar87);
    auVar121 = vpermt2ps_avx512vl(auVar44,_DAT_01feed00,auVar135);
    auVar100 = vpermt2ps_avx512vl(auVar45,_DAT_01feed00,auVar135);
    auVar122 = vsubps_avx512vl(auVar118,auVar100);
    auVar100 = vsubps_avx(auVar115,auVar99);
    auVar252 = ZEXT3264(auVar100);
    auVar111 = vsubps_avx(auVar116,auVar113);
    auVar112 = vsubps_avx(auVar117,auVar114);
    auVar246 = ZEXT3264(auVar112);
    auVar123 = vmulps_avx512vl(auVar111,auVar44);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar43,auVar112);
    auVar124 = vmulps_avx512vl(auVar112,auVar42);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar44,auVar100);
    auVar125 = vmulps_avx512vl(auVar100,auVar43);
    auVar125 = vfmsub231ps_avx512vl(auVar125,auVar42,auVar111);
    auVar125 = vmulps_avx512vl(auVar125,auVar125);
    auVar124 = vfmadd231ps_avx512vl(auVar125,auVar124,auVar124);
    auVar123 = vfmadd231ps_avx512vl(auVar124,auVar123,auVar123);
    auVar124 = vmulps_avx512vl(auVar112,auVar112);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar111,auVar111);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar100,auVar100);
    auVar125 = vrcp14ps_avx512vl(auVar124);
    auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar127 = vfnmadd213ps_avx512vl(auVar125,auVar124,auVar126);
    auVar125 = vfmadd132ps_avx512vl(auVar127,auVar125,auVar125);
    auVar123 = vmulps_avx512vl(auVar123,auVar125);
    auVar127 = vmulps_avx512vl(auVar111,auVar121);
    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar120,auVar112);
    auVar128 = vmulps_avx512vl(auVar112,auVar119);
    auVar128 = vfmsub231ps_avx512vl(auVar128,auVar121,auVar100);
    auVar129 = vmulps_avx512vl(auVar100,auVar120);
    auVar129 = vfmsub231ps_avx512vl(auVar129,auVar119,auVar111);
    auVar129 = vmulps_avx512vl(auVar129,auVar129);
    auVar128 = vfmadd231ps_avx512vl(auVar129,auVar128,auVar128);
    auVar127 = vfmadd231ps_avx512vl(auVar128,auVar127,auVar127);
    auVar125 = vmulps_avx512vl(auVar127,auVar125);
    auVar123 = vmaxps_avx512vl(auVar123,auVar125);
    auVar123 = vsqrtps_avx512vl(auVar123);
    auVar125 = vmaxps_avx512vl(auVar122,auVar118);
    auVar109 = vmaxps_avx512vl(auVar109,auVar125);
    auVar125 = vaddps_avx512vl(auVar123,auVar109);
    auVar109 = vminps_avx512vl(auVar122,auVar118);
    auVar109 = vminps_avx(auVar110,auVar109);
    auVar109 = vsubps_avx512vl(auVar109,auVar123);
    auVar127._8_4_ = 0x3f800002;
    auVar127._0_8_ = 0x3f8000023f800002;
    auVar127._12_4_ = 0x3f800002;
    auVar127._16_4_ = 0x3f800002;
    auVar127._20_4_ = 0x3f800002;
    auVar127._24_4_ = 0x3f800002;
    auVar127._28_4_ = 0x3f800002;
    auVar110 = vmulps_avx512vl(auVar125,auVar127);
    auVar128._8_4_ = 0x3f7ffffc;
    auVar128._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar128._12_4_ = 0x3f7ffffc;
    auVar128._16_4_ = 0x3f7ffffc;
    auVar128._20_4_ = 0x3f7ffffc;
    auVar128._24_4_ = 0x3f7ffffc;
    auVar128._28_4_ = 0x3f7ffffc;
    auVar109 = vmulps_avx512vl(auVar109,auVar128);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar118 = vrsqrt14ps_avx512vl(auVar124);
    auVar129._8_4_ = 0xbf000000;
    auVar129._0_8_ = 0xbf000000bf000000;
    auVar129._12_4_ = 0xbf000000;
    auVar129._16_4_ = 0xbf000000;
    auVar129._20_4_ = 0xbf000000;
    auVar129._24_4_ = 0xbf000000;
    auVar129._28_4_ = 0xbf000000;
    auVar122 = vmulps_avx512vl(auVar124,auVar129);
    fVar253 = auVar118._0_4_;
    fVar258 = auVar118._4_4_;
    fVar259 = auVar118._8_4_;
    fVar260 = auVar118._12_4_;
    fVar231 = auVar118._16_4_;
    fVar232 = auVar118._20_4_;
    fVar233 = auVar118._24_4_;
    auVar46._4_4_ = fVar258 * fVar258 * fVar258 * auVar122._4_4_;
    auVar46._0_4_ = fVar253 * fVar253 * fVar253 * auVar122._0_4_;
    auVar46._8_4_ = fVar259 * fVar259 * fVar259 * auVar122._8_4_;
    auVar46._12_4_ = fVar260 * fVar260 * fVar260 * auVar122._12_4_;
    auVar46._16_4_ = fVar231 * fVar231 * fVar231 * auVar122._16_4_;
    auVar46._20_4_ = fVar232 * fVar232 * fVar232 * auVar122._20_4_;
    auVar46._24_4_ = fVar233 * fVar233 * fVar233 * auVar122._24_4_;
    auVar46._28_4_ = auVar125._28_4_;
    auVar130._8_4_ = 0x3fc00000;
    auVar130._0_8_ = 0x3fc000003fc00000;
    auVar130._12_4_ = 0x3fc00000;
    auVar130._16_4_ = 0x3fc00000;
    auVar130._20_4_ = 0x3fc00000;
    auVar130._24_4_ = 0x3fc00000;
    auVar130._28_4_ = 0x3fc00000;
    auVar118 = vfmadd231ps_avx512vl(auVar46,auVar118,auVar130);
    auVar122 = vmulps_avx512vl(auVar100,auVar118);
    auVar123 = vmulps_avx512vl(auVar111,auVar118);
    auVar124 = vmulps_avx512vl(auVar112,auVar118);
    auVar125 = vsubps_avx512vl(auVar135,auVar99);
    auVar127 = vsubps_avx512vl(auVar135,auVar113);
    auVar128 = vsubps_avx512vl(auVar135,auVar114);
    auVar129 = vmulps_avx512vl(local_5e0,auVar128);
    auVar129 = vfmadd231ps_avx512vl(auVar129,local_5c0,auVar127);
    auVar129 = vfmadd231ps_avx512vl(auVar129,local_5a0,auVar125);
    auVar130 = vmulps_avx512vl(auVar128,auVar128);
    auVar130 = vfmadd231ps_avx512vl(auVar130,auVar127,auVar127);
    auVar130 = vfmadd231ps_avx512vl(auVar130,auVar125,auVar125);
    auVar131 = vmulps_avx512vl(local_5e0,auVar124);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar123,local_5c0);
    auVar132 = vfmadd231ps_avx512vl(auVar131,auVar122,local_5a0);
    auVar124 = vmulps_avx512vl(auVar128,auVar124);
    auVar123 = vfmadd231ps_avx512vl(auVar124,auVar127,auVar123);
    auVar122 = vfmadd231ps_avx512vl(auVar123,auVar125,auVar122);
    auVar123 = vmulps_avx512vl(auVar132,auVar132);
    auVar124 = vsubps_avx512vl(local_220,auVar123);
    auVar131 = vmulps_avx512vl(auVar132,auVar122);
    auVar129 = vsubps_avx512vl(auVar129,auVar131);
    auVar129 = vaddps_avx512vl(auVar129,auVar129);
    auVar131 = vmulps_avx512vl(auVar122,auVar122);
    local_820 = vsubps_avx512vl(auVar130,auVar131);
    auVar110 = vsubps_avx512vl(local_820,auVar110);
    local_740 = vmulps_avx512vl(auVar129,auVar129);
    auVar131._8_4_ = 0x40800000;
    auVar131._0_8_ = 0x4080000040800000;
    auVar131._12_4_ = 0x40800000;
    auVar131._16_4_ = 0x40800000;
    auVar131._20_4_ = 0x40800000;
    auVar131._24_4_ = 0x40800000;
    auVar131._28_4_ = 0x40800000;
    _local_8a0 = vmulps_avx512vl(auVar124,auVar131);
    auVar130 = vmulps_avx512vl(_local_8a0,auVar110);
    auVar130 = vsubps_avx512vl(local_740,auVar130);
    uVar82 = vcmpps_avx512vl(auVar130,auVar135,5);
    bVar70 = (byte)uVar82;
    fVar253 = (float)local_7e0._0_4_;
    fVar258 = (float)local_7e0._4_4_;
    fVar259 = fStack_7d8;
    fVar260 = fStack_7d4;
    fVar231 = fStack_7d0;
    fVar232 = fStack_7cc;
    fVar233 = fStack_7c8;
    fVar215 = fStack_7c4;
    if (bVar70 == 0) {
      auVar275 = ZEXT3264(auVar126);
LAB_01caa576:
      auVar271 = ZEXT3264(local_8e0);
      auVar272 = ZEXT3264(local_900);
      auVar273 = ZEXT3264(local_920);
      auVar274 = ZEXT3264(local_940);
    }
    else {
      auVar130 = vsqrtps_avx512vl(auVar130);
      auVar131 = vaddps_avx512vl(auVar124,auVar124);
      local_600 = vrcp14ps_avx512vl(auVar131);
      auVar126 = vfnmadd213ps_avx512vl(local_600,auVar131,auVar126);
      auVar126 = vfmadd132ps_avx512vl(auVar126,local_600,local_600);
      local_8c0 = vxorps_avx512vl(auVar129,auVar98);
      auVar98 = vsubps_avx512vl(local_8c0,auVar130);
      auVar98 = vmulps_avx512vl(auVar98,auVar126);
      auVar130 = vsubps_avx512vl(auVar130,auVar129);
      _local_620 = vmulps_avx512vl(auVar130,auVar126);
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar130 = vblendmps_avx512vl(auVar126,auVar98);
      auVar133._0_4_ =
           (uint)(bVar70 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar126._0_4_;
      bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
      auVar133._4_4_ = (uint)bVar7 * auVar130._4_4_ | (uint)!bVar7 * auVar126._4_4_;
      bVar7 = (bool)((byte)(uVar82 >> 2) & 1);
      auVar133._8_4_ = (uint)bVar7 * auVar130._8_4_ | (uint)!bVar7 * auVar126._8_4_;
      bVar7 = (bool)((byte)(uVar82 >> 3) & 1);
      auVar133._12_4_ = (uint)bVar7 * auVar130._12_4_ | (uint)!bVar7 * auVar126._12_4_;
      bVar7 = (bool)((byte)(uVar82 >> 4) & 1);
      auVar133._16_4_ = (uint)bVar7 * auVar130._16_4_ | (uint)!bVar7 * auVar126._16_4_;
      bVar7 = (bool)((byte)(uVar82 >> 5) & 1);
      auVar133._20_4_ = (uint)bVar7 * auVar130._20_4_ | (uint)!bVar7 * auVar126._20_4_;
      bVar7 = (bool)((byte)(uVar82 >> 6) & 1);
      auVar133._24_4_ = (uint)bVar7 * auVar130._24_4_ | (uint)!bVar7 * auVar126._24_4_;
      bVar7 = SUB81(uVar82 >> 7,0);
      auVar133._28_4_ = (uint)bVar7 * auVar130._28_4_ | (uint)!bVar7 * auVar126._28_4_;
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar130 = vblendmps_avx512vl(auVar126,_local_620);
      auVar134._0_4_ =
           (uint)(bVar70 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar126._0_4_;
      bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
      auVar134._4_4_ = (uint)bVar7 * auVar130._4_4_ | (uint)!bVar7 * auVar126._4_4_;
      bVar7 = (bool)((byte)(uVar82 >> 2) & 1);
      auVar134._8_4_ = (uint)bVar7 * auVar130._8_4_ | (uint)!bVar7 * auVar126._8_4_;
      bVar7 = (bool)((byte)(uVar82 >> 3) & 1);
      auVar134._12_4_ = (uint)bVar7 * auVar130._12_4_ | (uint)!bVar7 * auVar126._12_4_;
      bVar7 = (bool)((byte)(uVar82 >> 4) & 1);
      auVar134._16_4_ = (uint)bVar7 * auVar130._16_4_ | (uint)!bVar7 * auVar126._16_4_;
      bVar7 = (bool)((byte)(uVar82 >> 5) & 1);
      auVar134._20_4_ = (uint)bVar7 * auVar130._20_4_ | (uint)!bVar7 * auVar126._20_4_;
      bVar7 = (bool)((byte)(uVar82 >> 6) & 1);
      auVar134._24_4_ = (uint)bVar7 * auVar130._24_4_ | (uint)!bVar7 * auVar126._24_4_;
      bVar7 = SUB81(uVar82 >> 7,0);
      auVar134._28_4_ = (uint)bVar7 * auVar130._28_4_ | (uint)!bVar7 * auVar126._28_4_;
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar123,auVar126);
      local_640 = vmaxps_avx512vl(local_240,auVar126);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      local_660 = vmulps_avx512vl(local_640,auVar27);
      vandps_avx512vl(auVar124,auVar126);
      uVar74 = vcmpps_avx512vl(local_660,local_660,1);
      uVar82 = uVar82 & uVar74;
      bVar75 = (byte)uVar82;
      if (bVar75 != 0) {
        uVar74 = vcmpps_avx512vl(auVar110,_DAT_01faff00,2);
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar123 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar124 = vblendmps_avx512vl(auVar110,auVar123);
        bVar76 = (byte)uVar74;
        uVar84 = (uint)(bVar76 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar76 & 1) * local_660._0_4_;
        bVar7 = (bool)((byte)(uVar74 >> 1) & 1);
        uVar83 = (uint)bVar7 * auVar124._4_4_ | (uint)!bVar7 * local_660._4_4_;
        bVar7 = (bool)((byte)(uVar74 >> 2) & 1);
        uVar148 = (uint)bVar7 * auVar124._8_4_ | (uint)!bVar7 * local_660._8_4_;
        bVar7 = (bool)((byte)(uVar74 >> 3) & 1);
        uVar149 = (uint)bVar7 * auVar124._12_4_ | (uint)!bVar7 * local_660._12_4_;
        bVar7 = (bool)((byte)(uVar74 >> 4) & 1);
        uVar150 = (uint)bVar7 * auVar124._16_4_ | (uint)!bVar7 * local_660._16_4_;
        bVar7 = (bool)((byte)(uVar74 >> 5) & 1);
        uVar151 = (uint)bVar7 * auVar124._20_4_ | (uint)!bVar7 * local_660._20_4_;
        bVar7 = (bool)((byte)(uVar74 >> 6) & 1);
        uVar152 = (uint)bVar7 * auVar124._24_4_ | (uint)!bVar7 * local_660._24_4_;
        bVar7 = SUB81(uVar74 >> 7,0);
        uVar153 = (uint)bVar7 * auVar124._28_4_ | (uint)!bVar7 * local_660._28_4_;
        auVar133._0_4_ = (bVar75 & 1) * uVar84 | !(bool)(bVar75 & 1) * auVar133._0_4_;
        bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar133._4_4_ = bVar7 * uVar83 | !bVar7 * auVar133._4_4_;
        bVar7 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar133._8_4_ = bVar7 * uVar148 | !bVar7 * auVar133._8_4_;
        bVar7 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar133._12_4_ = bVar7 * uVar149 | !bVar7 * auVar133._12_4_;
        bVar7 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar133._16_4_ = bVar7 * uVar150 | !bVar7 * auVar133._16_4_;
        bVar7 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar133._20_4_ = bVar7 * uVar151 | !bVar7 * auVar133._20_4_;
        bVar7 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar133._24_4_ = bVar7 * uVar152 | !bVar7 * auVar133._24_4_;
        bVar7 = SUB81(uVar82 >> 7,0);
        auVar133._28_4_ = bVar7 * uVar153 | !bVar7 * auVar133._28_4_;
        auVar110 = vblendmps_avx512vl(auVar123,auVar110);
        bVar7 = (bool)((byte)(uVar74 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar74 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar74 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
        bVar14 = SUB81(uVar74 >> 7,0);
        auVar134._0_4_ =
             (uint)(bVar75 & 1) *
             ((uint)(bVar76 & 1) * auVar110._0_4_ | !(bool)(bVar76 & 1) * uVar84) |
             !(bool)(bVar75 & 1) * auVar134._0_4_;
        bVar8 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar134._4_4_ =
             (uint)bVar8 * ((uint)bVar7 * auVar110._4_4_ | !bVar7 * uVar83) |
             !bVar8 * auVar134._4_4_;
        bVar7 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar134._8_4_ =
             (uint)bVar7 * ((uint)bVar9 * auVar110._8_4_ | !bVar9 * uVar148) |
             !bVar7 * auVar134._8_4_;
        bVar7 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar134._12_4_ =
             (uint)bVar7 * ((uint)bVar10 * auVar110._12_4_ | !bVar10 * uVar149) |
             !bVar7 * auVar134._12_4_;
        bVar7 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar134._16_4_ =
             (uint)bVar7 * ((uint)bVar11 * auVar110._16_4_ | !bVar11 * uVar150) |
             !bVar7 * auVar134._16_4_;
        bVar7 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar134._20_4_ =
             (uint)bVar7 * ((uint)bVar12 * auVar110._20_4_ | !bVar12 * uVar151) |
             !bVar7 * auVar134._20_4_;
        bVar7 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar134._24_4_ =
             (uint)bVar7 * ((uint)bVar13 * auVar110._24_4_ | !bVar13 * uVar152) |
             !bVar7 * auVar134._24_4_;
        bVar7 = SUB81(uVar82 >> 7,0);
        auVar134._28_4_ =
             (uint)bVar7 * ((uint)bVar14 * auVar110._28_4_ | !bVar14 * uVar153) |
             !bVar7 * auVar134._28_4_;
        bVar70 = (~bVar75 | bVar76) & bVar70;
      }
      if ((bVar70 & 0x7f) == 0) {
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar275 = ZEXT3264(auVar109);
        goto LAB_01caa576;
      }
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar121 = vxorps_avx512vl(auVar121,auVar110);
      auVar119 = vxorps_avx512vl(auVar119,auVar110);
      uVar84 = *(uint *)(ray + k * 4 + 0x100);
      auVar120 = vxorps_avx512vl(auVar120,auVar110);
      local_840 = ZEXT416(uVar84);
      auVar87 = vsubss_avx512f(local_840,ZEXT416((uint)local_700._0_4_));
      auVar123 = vbroadcastss_avx512vl(auVar87);
      auVar123 = vminps_avx512vl(auVar123,auVar134);
      auVar68._4_4_ = fStack_2dc;
      auVar68._0_4_ = local_2e0;
      auVar68._8_4_ = fStack_2d8;
      auVar68._12_4_ = fStack_2d4;
      auVar68._16_4_ = fStack_2d0;
      auVar68._20_4_ = fStack_2cc;
      auVar68._24_4_ = fStack_2c8;
      auVar68._28_4_ = fStack_2c4;
      auVar124 = vmaxps_avx512vl(auVar68,auVar133);
      auVar126 = vmulps_avx512vl(auVar44,auVar128);
      auVar126 = vfmadd213ps_avx512vl(auVar127,auVar43,auVar126);
      auVar87 = vfmadd213ps_fma(auVar125,auVar42,auVar126);
      auVar125 = vmulps_avx512vl(local_5e0,auVar44);
      auVar125 = vfmadd231ps_avx512vl(auVar125,local_5c0,auVar43);
      auVar92 = vfmadd231ps_fma(auVar125,local_5a0,auVar42);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar92),auVar125);
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar17 = vcmpps_avx512vl(auVar125,auVar126,1);
      auVar127 = vxorps_avx512vl(ZEXT1632(auVar87),auVar110);
      auVar128 = vrcp14ps_avx512vl(ZEXT1632(auVar92));
      auVar228 = ZEXT1632(auVar92);
      auVar130 = vxorps_avx512vl(auVar228,auVar110);
      auVar135 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar136 = vfnmadd213ps_avx512vl(auVar128,auVar228,auVar135);
      auVar87 = vfmadd132ps_fma(auVar136,auVar128,auVar128);
      fVar234 = auVar87._0_4_ * auVar127._0_4_;
      fVar241 = auVar87._4_4_ * auVar127._4_4_;
      auVar47._4_4_ = fVar241;
      auVar47._0_4_ = fVar234;
      fVar242 = auVar87._8_4_ * auVar127._8_4_;
      auVar47._8_4_ = fVar242;
      fVar243 = auVar87._12_4_ * auVar127._12_4_;
      auVar47._12_4_ = fVar243;
      fVar156 = auVar127._16_4_ * 0.0;
      auVar47._16_4_ = fVar156;
      fVar172 = auVar127._20_4_ * 0.0;
      auVar47._20_4_ = fVar172;
      fVar173 = auVar127._24_4_ * 0.0;
      auVar47._24_4_ = fVar173;
      auVar47._28_4_ = auVar127._28_4_;
      uVar18 = vcmpps_avx512vl(auVar228,auVar130,1);
      bVar75 = (byte)uVar17 | (byte)uVar18;
      auVar270._8_4_ = 0xff800000;
      auVar270._0_8_ = 0xff800000ff800000;
      auVar270._12_4_ = 0xff800000;
      auVar270._16_4_ = 0xff800000;
      auVar270._20_4_ = 0xff800000;
      auVar270._24_4_ = 0xff800000;
      auVar270._28_4_ = 0xff800000;
      auVar136 = vblendmps_avx512vl(auVar47,auVar270);
      auVar137._0_4_ =
           (uint)(bVar75 & 1) * auVar136._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar128._0_4_;
      bVar7 = (bool)(bVar75 >> 1 & 1);
      auVar137._4_4_ = (uint)bVar7 * auVar136._4_4_ | (uint)!bVar7 * auVar128._4_4_;
      bVar7 = (bool)(bVar75 >> 2 & 1);
      auVar137._8_4_ = (uint)bVar7 * auVar136._8_4_ | (uint)!bVar7 * auVar128._8_4_;
      bVar7 = (bool)(bVar75 >> 3 & 1);
      auVar137._12_4_ = (uint)bVar7 * auVar136._12_4_ | (uint)!bVar7 * auVar128._12_4_;
      bVar7 = (bool)(bVar75 >> 4 & 1);
      auVar137._16_4_ = (uint)bVar7 * auVar136._16_4_ | (uint)!bVar7 * auVar128._16_4_;
      bVar7 = (bool)(bVar75 >> 5 & 1);
      auVar137._20_4_ = (uint)bVar7 * auVar136._20_4_ | (uint)!bVar7 * auVar128._20_4_;
      bVar7 = (bool)(bVar75 >> 6 & 1);
      auVar137._24_4_ = (uint)bVar7 * auVar136._24_4_ | (uint)!bVar7 * auVar128._24_4_;
      auVar137._28_4_ =
           (uint)(bVar75 >> 7) * auVar136._28_4_ | (uint)!(bool)(bVar75 >> 7) * auVar128._28_4_;
      auVar124 = vmaxps_avx512vl(auVar124,auVar137);
      auVar269 = ZEXT3264(auVar124);
      uVar18 = vcmpps_avx512vl(auVar228,auVar130,6);
      bVar75 = (byte)uVar17 | (byte)uVar18;
      auVar128 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar138._0_4_ =
           (uint)(bVar75 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar75 & 1) * (int)fVar234;
      bVar7 = (bool)(bVar75 >> 1 & 1);
      auVar138._4_4_ = (uint)bVar7 * auVar128._4_4_ | (uint)!bVar7 * (int)fVar241;
      bVar7 = (bool)(bVar75 >> 2 & 1);
      auVar138._8_4_ = (uint)bVar7 * auVar128._8_4_ | (uint)!bVar7 * (int)fVar242;
      bVar7 = (bool)(bVar75 >> 3 & 1);
      auVar138._12_4_ = (uint)bVar7 * auVar128._12_4_ | (uint)!bVar7 * (int)fVar243;
      bVar7 = (bool)(bVar75 >> 4 & 1);
      auVar138._16_4_ = (uint)bVar7 * auVar128._16_4_ | (uint)!bVar7 * (int)fVar156;
      bVar7 = (bool)(bVar75 >> 5 & 1);
      auVar138._20_4_ = (uint)bVar7 * auVar128._20_4_ | (uint)!bVar7 * (int)fVar172;
      bVar7 = (bool)(bVar75 >> 6 & 1);
      auVar138._24_4_ = (uint)bVar7 * auVar128._24_4_ | (uint)!bVar7 * (int)fVar173;
      auVar138._28_4_ =
           (uint)(bVar75 >> 7) * auVar128._28_4_ | (uint)!(bool)(bVar75 >> 7) * auVar127._28_4_;
      auVar127 = vminps_avx512vl(auVar123,auVar138);
      auVar87 = vxorps_avx512vl(auVar123._0_16_,auVar123._0_16_);
      auVar115 = vsubps_avx512vl(ZEXT1632(auVar87),auVar115);
      auVar116 = vsubps_avx512vl(ZEXT1632(auVar87),auVar116);
      auVar123 = ZEXT1632(auVar87);
      auVar117 = vsubps_avx512vl(auVar123,auVar117);
      auVar117 = vmulps_avx512vl(auVar117,auVar121);
      auVar116 = vfmadd231ps_avx512vl(auVar117,auVar120,auVar116);
      auVar115 = vfmadd231ps_avx512vl(auVar116,auVar119,auVar115);
      auVar116 = vmulps_avx512vl(local_5e0,auVar121);
      auVar116 = vfmadd231ps_avx512vl(auVar116,local_5c0,auVar120);
      auVar116 = vfmadd231ps_avx512vl(auVar116,local_5a0,auVar119);
      vandps_avx512vl(auVar116,auVar125);
      uVar17 = vcmpps_avx512vl(auVar116,auVar126,1);
      auVar115 = vxorps_avx512vl(auVar115,auVar110);
      auVar117 = vrcp14ps_avx512vl(auVar116);
      auVar110 = vxorps_avx512vl(auVar116,auVar110);
      auVar266 = ZEXT3264(auVar110);
      auVar119 = vfnmadd213ps_avx512vl(auVar117,auVar116,auVar135);
      auVar87 = vfmadd132ps_fma(auVar119,auVar117,auVar117);
      fVar234 = auVar87._0_4_ * auVar115._0_4_;
      fVar241 = auVar87._4_4_ * auVar115._4_4_;
      auVar48._4_4_ = fVar241;
      auVar48._0_4_ = fVar234;
      fVar242 = auVar87._8_4_ * auVar115._8_4_;
      auVar48._8_4_ = fVar242;
      fVar243 = auVar87._12_4_ * auVar115._12_4_;
      auVar48._12_4_ = fVar243;
      fVar156 = auVar115._16_4_ * 0.0;
      auVar48._16_4_ = fVar156;
      fVar172 = auVar115._20_4_ * 0.0;
      auVar48._20_4_ = fVar172;
      fVar173 = auVar115._24_4_ * 0.0;
      auVar48._24_4_ = fVar173;
      auVar48._28_4_ = auVar115._28_4_;
      uVar18 = vcmpps_avx512vl(auVar116,auVar110,1);
      bVar75 = (byte)uVar17 | (byte)uVar18;
      auVar119 = vblendmps_avx512vl(auVar48,auVar270);
      auVar139._0_4_ =
           (uint)(bVar75 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar117._0_4_;
      bVar7 = (bool)(bVar75 >> 1 & 1);
      auVar139._4_4_ = (uint)bVar7 * auVar119._4_4_ | (uint)!bVar7 * auVar117._4_4_;
      bVar7 = (bool)(bVar75 >> 2 & 1);
      auVar139._8_4_ = (uint)bVar7 * auVar119._8_4_ | (uint)!bVar7 * auVar117._8_4_;
      bVar7 = (bool)(bVar75 >> 3 & 1);
      auVar139._12_4_ = (uint)bVar7 * auVar119._12_4_ | (uint)!bVar7 * auVar117._12_4_;
      bVar7 = (bool)(bVar75 >> 4 & 1);
      auVar139._16_4_ = (uint)bVar7 * auVar119._16_4_ | (uint)!bVar7 * auVar117._16_4_;
      bVar7 = (bool)(bVar75 >> 5 & 1);
      auVar139._20_4_ = (uint)bVar7 * auVar119._20_4_ | (uint)!bVar7 * auVar117._20_4_;
      bVar7 = (bool)(bVar75 >> 6 & 1);
      auVar139._24_4_ = (uint)bVar7 * auVar119._24_4_ | (uint)!bVar7 * auVar117._24_4_;
      auVar139._28_4_ =
           (uint)(bVar75 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar75 >> 7) * auVar117._28_4_;
      auVar264 = ZEXT3264(auVar139);
      _local_680 = vmaxps_avx(auVar124,auVar139);
      auVar257 = ZEXT3264(_local_680);
      uVar18 = vcmpps_avx512vl(auVar116,auVar110,6);
      bVar75 = (byte)uVar17 | (byte)uVar18;
      auVar140._0_4_ =
           (uint)(bVar75 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar75 & 1) * (int)fVar234;
      bVar7 = (bool)(bVar75 >> 1 & 1);
      auVar140._4_4_ = (uint)bVar7 * auVar128._4_4_ | (uint)!bVar7 * (int)fVar241;
      bVar7 = (bool)(bVar75 >> 2 & 1);
      auVar140._8_4_ = (uint)bVar7 * auVar128._8_4_ | (uint)!bVar7 * (int)fVar242;
      bVar7 = (bool)(bVar75 >> 3 & 1);
      auVar140._12_4_ = (uint)bVar7 * auVar128._12_4_ | (uint)!bVar7 * (int)fVar243;
      bVar7 = (bool)(bVar75 >> 4 & 1);
      auVar140._16_4_ = (uint)bVar7 * auVar128._16_4_ | (uint)!bVar7 * (int)fVar156;
      bVar7 = (bool)(bVar75 >> 5 & 1);
      auVar140._20_4_ = (uint)bVar7 * auVar128._20_4_ | (uint)!bVar7 * (int)fVar172;
      bVar7 = (bool)(bVar75 >> 6 & 1);
      auVar140._24_4_ = (uint)bVar7 * auVar128._24_4_ | (uint)!bVar7 * (int)fVar173;
      auVar140._28_4_ =
           (uint)(bVar75 >> 7) * auVar128._28_4_ | (uint)!(bool)(bVar75 >> 7) * auVar115._28_4_;
      local_360 = vminps_avx(auVar127,auVar140);
      auVar262 = ZEXT3264(local_360);
      uVar17 = vcmpps_avx512vl(_local_680,local_360,2);
      bVar70 = bVar70 & 0x7f & (byte)uVar17;
      if (bVar70 == 0) {
        auVar275 = ZEXT3264(auVar135);
        goto LAB_01caa576;
      }
      auVar110 = vmaxps_avx512vl(auVar123,auVar109);
      auVar109 = vfmadd213ps_avx512vl(auVar98,auVar132,auVar122);
      auVar109 = vmulps_avx512vl(auVar118,auVar109);
      auVar98 = vfmadd213ps_avx512vl(_local_620,auVar132,auVar122);
      auVar49._4_4_ = auVar118._4_4_ * auVar98._4_4_;
      auVar49._0_4_ = auVar118._0_4_ * auVar98._0_4_;
      auVar49._8_4_ = auVar118._8_4_ * auVar98._8_4_;
      auVar49._12_4_ = auVar118._12_4_ * auVar98._12_4_;
      auVar49._16_4_ = auVar118._16_4_ * auVar98._16_4_;
      auVar49._20_4_ = auVar118._20_4_ * auVar98._20_4_;
      auVar49._24_4_ = auVar118._24_4_ * auVar98._24_4_;
      auVar49._28_4_ = auVar139._28_4_;
      auVar109 = vminps_avx512vl(auVar109,auVar135);
      auVar56 = ZEXT812(0);
      auVar98 = ZEXT1232(auVar56) << 0x20;
      auVar109 = vmaxps_avx(auVar109,ZEXT1232(auVar56) << 0x20);
      auVar115 = vminps_avx512vl(auVar49,auVar135);
      auVar50._4_4_ = (auVar109._4_4_ + 1.0) * 0.125;
      auVar50._0_4_ = (auVar109._0_4_ + 0.0) * 0.125;
      auVar50._8_4_ = (auVar109._8_4_ + 2.0) * 0.125;
      auVar50._12_4_ = (auVar109._12_4_ + 3.0) * 0.125;
      auVar50._16_4_ = (auVar109._16_4_ + 4.0) * 0.125;
      auVar50._20_4_ = (auVar109._20_4_ + 5.0) * 0.125;
      auVar50._24_4_ = (auVar109._24_4_ + 6.0) * 0.125;
      auVar50._28_4_ = auVar109._28_4_ + 7.0;
      auVar87 = vfmadd213ps_fma(auVar50,auVar163,local_880);
      local_1a0 = ZEXT1632(auVar87);
      auVar109 = vmaxps_avx(auVar115,ZEXT1232(auVar56) << 0x20);
      auVar51._4_4_ = (auVar109._4_4_ + 1.0) * 0.125;
      auVar51._0_4_ = (auVar109._0_4_ + 0.0) * 0.125;
      auVar51._8_4_ = (auVar109._8_4_ + 2.0) * 0.125;
      auVar51._12_4_ = (auVar109._12_4_ + 3.0) * 0.125;
      auVar51._16_4_ = (auVar109._16_4_ + 4.0) * 0.125;
      auVar51._20_4_ = (auVar109._20_4_ + 5.0) * 0.125;
      auVar51._24_4_ = (auVar109._24_4_ + 6.0) * 0.125;
      auVar51._28_4_ = auVar109._28_4_ + 7.0;
      auVar87 = vfmadd213ps_fma(auVar51,auVar163,local_880);
      local_1c0 = ZEXT1632(auVar87);
      auVar52._4_4_ = auVar110._4_4_ * auVar110._4_4_;
      auVar52._0_4_ = auVar110._0_4_ * auVar110._0_4_;
      auVar52._8_4_ = auVar110._8_4_ * auVar110._8_4_;
      auVar52._12_4_ = auVar110._12_4_ * auVar110._12_4_;
      auVar52._16_4_ = auVar110._16_4_ * auVar110._16_4_;
      auVar52._20_4_ = auVar110._20_4_ * auVar110._20_4_;
      auVar52._24_4_ = auVar110._24_4_ * auVar110._24_4_;
      auVar52._28_4_ = auVar110._28_4_;
      auVar109 = vsubps_avx(local_820,auVar52);
      auVar53._4_4_ = auVar109._4_4_ * (float)local_8a0._4_4_;
      auVar53._0_4_ = auVar109._0_4_ * (float)local_8a0._0_4_;
      auVar53._8_4_ = auVar109._8_4_ * fStack_898;
      auVar53._12_4_ = auVar109._12_4_ * fStack_894;
      auVar53._16_4_ = auVar109._16_4_ * fStack_890;
      auVar53._20_4_ = auVar109._20_4_ * fStack_88c;
      auVar53._24_4_ = auVar109._24_4_ * fStack_888;
      auVar53._28_4_ = auVar110._28_4_;
      auVar110 = vsubps_avx(local_740,auVar53);
      uVar17 = vcmpps_avx512vl(auVar110,ZEXT1232(auVar56) << 0x20,5);
      bVar75 = (byte)uVar17;
      auVar273 = ZEXT3264(local_920);
      auVar274 = ZEXT3264(local_940);
      if (bVar75 == 0) {
        bVar75 = 0;
        auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar246 = ZEXT864(0) << 0x20;
        auVar110 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar115 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar264 = ZEXT864(0) << 0x20;
        auVar141._8_4_ = 0x7f800000;
        auVar141._0_8_ = 0x7f8000007f800000;
        auVar141._12_4_ = 0x7f800000;
        auVar141._16_4_ = 0x7f800000;
        auVar141._20_4_ = 0x7f800000;
        auVar141._24_4_ = 0x7f800000;
        auVar141._28_4_ = 0x7f800000;
        auVar142._8_4_ = 0xff800000;
        auVar142._0_8_ = 0xff800000ff800000;
        auVar142._12_4_ = 0xff800000;
        auVar142._16_4_ = 0xff800000;
        auVar142._20_4_ = 0xff800000;
        auVar142._24_4_ = 0xff800000;
        auVar142._28_4_ = 0xff800000;
      }
      else {
        uVar82 = vcmpps_avx512vl(auVar110,auVar123,5);
        auVar110 = vsqrtps_avx(auVar110);
        auVar98 = vfnmadd213ps_avx512vl(auVar131,local_600,auVar135);
        auVar116 = vfmadd132ps_avx512vl(auVar98,local_600,local_600);
        auVar98 = vsubps_avx(local_8c0,auVar110);
        auVar117 = vmulps_avx512vl(auVar98,auVar116);
        auVar110 = vsubps_avx512vl(auVar110,auVar129);
        auVar116 = vmulps_avx512vl(auVar110,auVar116);
        auVar110 = vfmadd213ps_avx512vl(auVar132,auVar117,auVar122);
        auVar54._4_4_ = auVar118._4_4_ * auVar110._4_4_;
        auVar54._0_4_ = auVar118._0_4_ * auVar110._0_4_;
        auVar54._8_4_ = auVar118._8_4_ * auVar110._8_4_;
        auVar54._12_4_ = auVar118._12_4_ * auVar110._12_4_;
        auVar54._16_4_ = auVar118._16_4_ * auVar110._16_4_;
        auVar54._20_4_ = auVar118._20_4_ * auVar110._20_4_;
        auVar54._24_4_ = auVar118._24_4_ * auVar110._24_4_;
        auVar54._28_4_ = auVar115._28_4_;
        auVar110 = vmulps_avx512vl(local_5a0,auVar117);
        auVar98 = vmulps_avx512vl(local_5c0,auVar117);
        auVar119 = vmulps_avx512vl(local_5e0,auVar117);
        auVar115 = vfmadd213ps_avx512vl(auVar100,auVar54,auVar99);
        auVar110 = vsubps_avx512vl(auVar110,auVar115);
        auVar115 = vfmadd213ps_avx512vl(auVar111,auVar54,auVar113);
        auVar115 = vsubps_avx512vl(auVar98,auVar115);
        auVar87 = vfmadd213ps_fma(auVar54,auVar112,auVar114);
        auVar98 = vsubps_avx(auVar119,ZEXT1632(auVar87));
        auVar264 = ZEXT3264(auVar98);
        auVar98 = vfmadd213ps_avx512vl(auVar132,auVar116,auVar122);
        auVar118 = vmulps_avx512vl(auVar118,auVar98);
        auVar98 = vmulps_avx512vl(local_5a0,auVar116);
        auVar119 = vmulps_avx512vl(local_5c0,auVar116);
        auVar120 = vmulps_avx512vl(local_5e0,auVar116);
        auVar87 = vfmadd213ps_fma(auVar100,auVar118,auVar99);
        auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar87));
        auVar87 = vfmadd213ps_fma(auVar111,auVar118,auVar113);
        auVar100 = vsubps_avx512vl(auVar119,ZEXT1632(auVar87));
        auVar87 = vfmadd213ps_fma(auVar112,auVar118,auVar114);
        auVar111 = vsubps_avx512vl(auVar120,ZEXT1632(auVar87));
        auVar246 = ZEXT3264(auVar111);
        auVar164._8_4_ = 0x7f800000;
        auVar164._0_8_ = 0x7f8000007f800000;
        auVar164._12_4_ = 0x7f800000;
        auVar164._16_4_ = 0x7f800000;
        auVar164._20_4_ = 0x7f800000;
        auVar164._24_4_ = 0x7f800000;
        auVar164._28_4_ = 0x7f800000;
        auVar111 = vblendmps_avx512vl(auVar164,auVar117);
        bVar7 = (bool)((byte)uVar82 & 1);
        auVar141._0_4_ = (uint)bVar7 * auVar111._0_4_ | (uint)!bVar7 * auVar99._0_4_;
        bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar141._4_4_ = (uint)bVar7 * auVar111._4_4_ | (uint)!bVar7 * auVar99._4_4_;
        bVar7 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar141._8_4_ = (uint)bVar7 * auVar111._8_4_ | (uint)!bVar7 * auVar99._8_4_;
        bVar7 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar141._12_4_ = (uint)bVar7 * auVar111._12_4_ | (uint)!bVar7 * auVar99._12_4_;
        bVar7 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar141._16_4_ = (uint)bVar7 * auVar111._16_4_ | (uint)!bVar7 * auVar99._16_4_;
        bVar7 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar141._20_4_ = (uint)bVar7 * auVar111._20_4_ | (uint)!bVar7 * auVar99._20_4_;
        bVar7 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar141._24_4_ = (uint)bVar7 * auVar111._24_4_ | (uint)!bVar7 * auVar99._24_4_;
        bVar7 = SUB81(uVar82 >> 7,0);
        auVar141._28_4_ = (uint)bVar7 * auVar111._28_4_ | (uint)!bVar7 * auVar99._28_4_;
        auVar165._8_4_ = 0xff800000;
        auVar165._0_8_ = 0xff800000ff800000;
        auVar165._12_4_ = 0xff800000;
        auVar165._16_4_ = 0xff800000;
        auVar165._20_4_ = 0xff800000;
        auVar165._24_4_ = 0xff800000;
        auVar165._28_4_ = 0xff800000;
        auVar111 = vblendmps_avx512vl(auVar165,auVar116);
        bVar7 = (bool)((byte)uVar82 & 1);
        auVar142._0_4_ = (uint)bVar7 * auVar111._0_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar142._4_4_ = (uint)bVar7 * auVar111._4_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar142._8_4_ = (uint)bVar7 * auVar111._8_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar142._12_4_ = (uint)bVar7 * auVar111._12_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar142._16_4_ = (uint)bVar7 * auVar111._16_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar142._20_4_ = (uint)bVar7 * auVar111._20_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar142._24_4_ = (uint)bVar7 * auVar111._24_4_ | (uint)!bVar7 * -0x800000;
        bVar7 = SUB81(uVar82 >> 7,0);
        auVar142._28_4_ = (uint)bVar7 * auVar111._28_4_ | (uint)!bVar7 * -0x800000;
        auVar28._8_4_ = 0x36000000;
        auVar28._0_8_ = 0x3600000036000000;
        auVar28._12_4_ = 0x36000000;
        auVar28._16_4_ = 0x36000000;
        auVar28._20_4_ = 0x36000000;
        auVar28._24_4_ = 0x36000000;
        auVar28._28_4_ = 0x36000000;
        auVar111 = vmulps_avx512vl(local_640,auVar28);
        uVar74 = vcmpps_avx512vl(auVar111,local_660,0xe);
        uVar82 = uVar82 & uVar74;
        bVar76 = (byte)uVar82;
        if (bVar76 != 0) {
          uVar74 = vcmpps_avx512vl(auVar109,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar251._8_4_ = 0x7f800000;
          auVar251._0_8_ = 0x7f8000007f800000;
          auVar251._12_4_ = 0x7f800000;
          auVar251._16_4_ = 0x7f800000;
          auVar251._20_4_ = 0x7f800000;
          auVar251._24_4_ = 0x7f800000;
          auVar251._28_4_ = 0x7f800000;
          auVar256._8_4_ = 0xff800000;
          auVar256._0_8_ = 0xff800000ff800000;
          auVar256._12_4_ = 0xff800000;
          auVar256._16_4_ = 0xff800000;
          auVar256._20_4_ = 0xff800000;
          auVar256._24_4_ = 0xff800000;
          auVar256._28_4_ = 0xff800000;
          auVar109 = vblendmps_avx512vl(auVar251,auVar256);
          bVar80 = (byte)uVar74;
          uVar83 = (uint)(bVar80 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar111._0_4_;
          bVar7 = (bool)((byte)(uVar74 >> 1) & 1);
          uVar148 = (uint)bVar7 * auVar109._4_4_ | (uint)!bVar7 * auVar111._4_4_;
          bVar7 = (bool)((byte)(uVar74 >> 2) & 1);
          uVar149 = (uint)bVar7 * auVar109._8_4_ | (uint)!bVar7 * auVar111._8_4_;
          bVar7 = (bool)((byte)(uVar74 >> 3) & 1);
          uVar150 = (uint)bVar7 * auVar109._12_4_ | (uint)!bVar7 * auVar111._12_4_;
          bVar7 = (bool)((byte)(uVar74 >> 4) & 1);
          uVar151 = (uint)bVar7 * auVar109._16_4_ | (uint)!bVar7 * auVar111._16_4_;
          bVar7 = (bool)((byte)(uVar74 >> 5) & 1);
          uVar152 = (uint)bVar7 * auVar109._20_4_ | (uint)!bVar7 * auVar111._20_4_;
          bVar7 = (bool)((byte)(uVar74 >> 6) & 1);
          uVar153 = (uint)bVar7 * auVar109._24_4_ | (uint)!bVar7 * auVar111._24_4_;
          bVar7 = SUB81(uVar74 >> 7,0);
          uVar154 = (uint)bVar7 * auVar109._28_4_ | (uint)!bVar7 * auVar111._28_4_;
          auVar141._0_4_ = (bVar76 & 1) * uVar83 | !(bool)(bVar76 & 1) * auVar141._0_4_;
          bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar141._4_4_ = bVar7 * uVar148 | !bVar7 * auVar141._4_4_;
          bVar7 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar141._8_4_ = bVar7 * uVar149 | !bVar7 * auVar141._8_4_;
          bVar7 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar141._12_4_ = bVar7 * uVar150 | !bVar7 * auVar141._12_4_;
          bVar7 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar141._16_4_ = bVar7 * uVar151 | !bVar7 * auVar141._16_4_;
          bVar7 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar141._20_4_ = bVar7 * uVar152 | !bVar7 * auVar141._20_4_;
          bVar7 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar141._24_4_ = bVar7 * uVar153 | !bVar7 * auVar141._24_4_;
          bVar7 = SUB81(uVar82 >> 7,0);
          auVar141._28_4_ = bVar7 * uVar154 | !bVar7 * auVar141._28_4_;
          auVar109 = vblendmps_avx512vl(auVar256,auVar251);
          bVar7 = (bool)((byte)(uVar74 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar74 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar74 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar74 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
          bVar14 = SUB81(uVar74 >> 7,0);
          auVar142._0_4_ =
               (uint)(bVar76 & 1) *
               ((uint)(bVar80 & 1) * auVar109._0_4_ | !(bool)(bVar80 & 1) * uVar83) |
               !(bool)(bVar76 & 1) * auVar142._0_4_;
          bVar8 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar142._4_4_ =
               (uint)bVar8 * ((uint)bVar7 * auVar109._4_4_ | !bVar7 * uVar148) |
               !bVar8 * auVar142._4_4_;
          bVar7 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar142._8_4_ =
               (uint)bVar7 * ((uint)bVar9 * auVar109._8_4_ | !bVar9 * uVar149) |
               !bVar7 * auVar142._8_4_;
          bVar7 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar142._12_4_ =
               (uint)bVar7 * ((uint)bVar10 * auVar109._12_4_ | !bVar10 * uVar150) |
               !bVar7 * auVar142._12_4_;
          bVar7 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar142._16_4_ =
               (uint)bVar7 * ((uint)bVar11 * auVar109._16_4_ | !bVar11 * uVar151) |
               !bVar7 * auVar142._16_4_;
          bVar7 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar142._20_4_ =
               (uint)bVar7 * ((uint)bVar12 * auVar109._20_4_ | !bVar12 * uVar152) |
               !bVar7 * auVar142._20_4_;
          bVar7 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar142._24_4_ =
               (uint)bVar7 * ((uint)bVar13 * auVar109._24_4_ | !bVar13 * uVar153) |
               !bVar7 * auVar142._24_4_;
          bVar7 = SUB81(uVar82 >> 7,0);
          auVar142._28_4_ =
               (uint)bVar7 * ((uint)bVar14 * auVar109._28_4_ | !bVar14 * uVar154) |
               !bVar7 * auVar142._28_4_;
          bVar75 = (~bVar76 | bVar80) & bVar75;
        }
      }
      auVar269 = ZEXT3264(local_5e0);
      auVar252._0_4_ = local_5e0._0_4_ * auVar246._0_4_;
      auVar252._4_4_ = local_5e0._4_4_ * auVar246._4_4_;
      auVar252._8_4_ = local_5e0._8_4_ * auVar246._8_4_;
      auVar252._12_4_ = local_5e0._12_4_ * auVar246._12_4_;
      auVar252._16_4_ = local_5e0._16_4_ * auVar246._16_4_;
      auVar252._20_4_ = local_5e0._20_4_ * auVar246._20_4_;
      auVar252._28_36_ = auVar246._28_36_;
      auVar252._24_4_ = local_5e0._24_4_ * auVar246._24_4_;
      auVar257 = ZEXT3264(local_5c0);
      auVar87 = vfmadd231ps_fma(auVar252._0_32_,local_5c0,auVar100);
      auVar252 = ZEXT3264(local_5a0);
      auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),local_5a0,auVar98);
      auVar266 = ZEXT3264(_local_680);
      _local_200 = _local_680;
      local_1e0 = vminps_avx(local_360,auVar141);
      auVar248._8_4_ = 0x7fffffff;
      auVar248._0_8_ = 0x7fffffff7fffffff;
      auVar248._12_4_ = 0x7fffffff;
      auVar248._16_4_ = 0x7fffffff;
      auVar248._20_4_ = 0x7fffffff;
      auVar248._24_4_ = 0x7fffffff;
      auVar248._28_4_ = 0x7fffffff;
      auVar109 = vandps_avx(ZEXT1632(auVar87),auVar248);
      local_380 = vmaxps_avx(_local_680,auVar142);
      auVar246 = ZEXT3264(local_380);
      auVar167._8_4_ = 0x3e99999a;
      auVar167._0_8_ = 0x3e99999a3e99999a;
      auVar167._12_4_ = 0x3e99999a;
      auVar167._16_4_ = 0x3e99999a;
      auVar167._20_4_ = 0x3e99999a;
      auVar167._24_4_ = 0x3e99999a;
      auVar167._28_4_ = 0x3e99999a;
      uVar17 = vcmpps_avx512vl(auVar109,auVar167,1);
      local_580._0_2_ = (short)uVar17;
      uVar17 = vcmpps_avx512vl(_local_680,local_1e0,2);
      bVar76 = (byte)uVar17 & bVar70;
      uVar18 = vcmpps_avx512vl(local_380,local_360,2);
      auVar271 = ZEXT3264(local_8e0);
      auVar272 = ZEXT3264(local_900);
      if ((bVar70 & ((byte)uVar18 | (byte)uVar17)) == 0) {
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar275 = ZEXT3264(auVar109);
      }
      else {
        auVar55._4_4_ = local_5e0._4_4_ * auVar264._4_4_;
        auVar55._0_4_ = local_5e0._0_4_ * auVar264._0_4_;
        auVar55._8_4_ = local_5e0._8_4_ * auVar264._8_4_;
        auVar55._12_4_ = local_5e0._12_4_ * auVar264._12_4_;
        auVar55._16_4_ = local_5e0._16_4_ * auVar264._16_4_;
        auVar55._20_4_ = local_5e0._20_4_ * auVar264._20_4_;
        auVar55._24_4_ = local_5e0._24_4_ * auVar264._24_4_;
        auVar55._28_4_ = 0x3e99999a;
        auVar87 = vfmadd213ps_fma(auVar115,local_5c0,auVar55);
        auVar87 = vfmadd213ps_fma(auVar110,local_5a0,ZEXT1632(auVar87));
        auVar109 = vandps_avx(ZEXT1632(auVar87),auVar248);
        uVar17 = vcmpps_avx512vl(auVar109,auVar167,1);
        bVar80 = (byte)uVar17 | ~bVar75;
        auVar168._8_4_ = 2;
        auVar168._0_8_ = 0x200000002;
        auVar168._12_4_ = 2;
        auVar168._16_4_ = 2;
        auVar168._20_4_ = 2;
        auVar168._24_4_ = 2;
        auVar168._28_4_ = 2;
        auVar29._8_4_ = 3;
        auVar29._0_8_ = 0x300000003;
        auVar29._12_4_ = 3;
        auVar29._16_4_ = 3;
        auVar29._20_4_ = 3;
        auVar29._24_4_ = 3;
        auVar29._28_4_ = 3;
        auVar109 = vpblendmd_avx512vl(auVar168,auVar29);
        local_320._0_4_ = (uint)(bVar80 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar80 & 1) * 2;
        bVar7 = (bool)(bVar80 >> 1 & 1);
        local_320._4_4_ = (uint)bVar7 * auVar109._4_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar80 >> 2 & 1);
        local_320._8_4_ = (uint)bVar7 * auVar109._8_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar80 >> 3 & 1);
        local_320._12_4_ = (uint)bVar7 * auVar109._12_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar80 >> 4 & 1);
        local_320._16_4_ = (uint)bVar7 * auVar109._16_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar80 >> 5 & 1);
        local_320._20_4_ = (uint)bVar7 * auVar109._20_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar80 >> 6 & 1);
        local_320._24_4_ = (uint)bVar7 * auVar109._24_4_ | (uint)!bVar7 * 2;
        local_320._28_4_ = (uint)(bVar80 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar80 >> 7) * 2;
        local_500 = vpbroadcastd_avx512vl();
        uVar17 = vpcmpd_avx512vl(local_500,local_320,5);
        bVar80 = (byte)uVar17 & bVar76;
        if (bVar80 == 0) {
          auVar170._4_4_ = uVar84;
          auVar170._0_4_ = uVar84;
          auVar170._8_4_ = uVar84;
          auVar170._12_4_ = uVar84;
          auVar170._16_4_ = uVar84;
          auVar170._20_4_ = uVar84;
          auVar170._24_4_ = uVar84;
          auVar170._28_4_ = uVar84;
        }
        else {
          local_340 = local_380;
          auVar92 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar87 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar85 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar97 = vminps_avx(auVar92,auVar85);
          auVar92 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar85 = vmaxps_avx(auVar87,auVar92);
          auVar195._8_4_ = 0x7fffffff;
          auVar195._0_8_ = 0x7fffffff7fffffff;
          auVar195._12_4_ = 0x7fffffff;
          auVar87 = vandps_avx(auVar97,auVar195);
          auVar92 = vandps_avx(auVar85,auVar195);
          auVar87 = vmaxps_avx(auVar87,auVar92);
          auVar92 = vmovshdup_avx(auVar87);
          auVar92 = vmaxss_avx(auVar92,auVar87);
          auVar87 = vshufpd_avx(auVar87,auVar87,1);
          auVar87 = vmaxss_avx(auVar87,auVar92);
          local_860._0_4_ = auVar87._0_4_ * 1.9073486e-06;
          local_6f0 = vshufps_avx(auVar85,auVar85,0xff);
          local_560 = (float)local_680._0_4_ + (float)local_7e0._0_4_;
          fStack_55c = (float)local_680._4_4_ + (float)local_7e0._4_4_;
          fStack_558 = fStack_678 + fStack_7d8;
          fStack_554 = fStack_674 + fStack_7d4;
          fStack_550 = fStack_670 + fStack_7d0;
          fStack_54c = fStack_66c + fStack_7cc;
          fStack_548 = fStack_668 + fStack_7c8;
          fStack_544 = fStack_664 + fStack_7c4;
          do {
            auVar169._8_4_ = 0x7f800000;
            auVar169._0_8_ = 0x7f8000007f800000;
            auVar169._12_4_ = 0x7f800000;
            auVar169._16_4_ = 0x7f800000;
            auVar169._20_4_ = 0x7f800000;
            auVar169._24_4_ = 0x7f800000;
            auVar169._28_4_ = 0x7f800000;
            auVar109 = vblendmps_avx512vl(auVar169,_local_680);
            auVar144._0_4_ =
                 (uint)(bVar80 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
            bVar7 = (bool)(bVar80 >> 1 & 1);
            auVar144._4_4_ = (uint)bVar7 * auVar109._4_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar80 >> 2 & 1);
            auVar144._8_4_ = (uint)bVar7 * auVar109._8_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar80 >> 3 & 1);
            auVar144._12_4_ = (uint)bVar7 * auVar109._12_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar80 >> 4 & 1);
            auVar144._16_4_ = (uint)bVar7 * auVar109._16_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar80 >> 5 & 1);
            auVar144._20_4_ = (uint)bVar7 * auVar109._20_4_ | (uint)!bVar7 * 0x7f800000;
            auVar144._24_4_ =
                 (uint)(bVar80 >> 6) * auVar109._24_4_ | (uint)!(bool)(bVar80 >> 6) * 0x7f800000;
            auVar144._28_4_ = 0x7f800000;
            auVar109 = vshufps_avx(auVar144,auVar144,0xb1);
            auVar109 = vminps_avx(auVar144,auVar109);
            auVar110 = vshufpd_avx(auVar109,auVar109,5);
            auVar109 = vminps_avx(auVar109,auVar110);
            auVar110 = vpermpd_avx2(auVar109,0x4e);
            auVar109 = vminps_avx(auVar109,auVar110);
            uVar17 = vcmpps_avx512vl(auVar144,auVar109,0);
            bVar71 = (byte)uVar17 & bVar80;
            bVar72 = bVar80;
            if (bVar71 != 0) {
              bVar72 = bVar71;
            }
            iVar20 = 0;
            for (uVar84 = (uint)bVar72; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            uVar84 = *(uint *)(local_200 + (uint)(iVar20 << 2));
            fVar253 = auVar16._0_4_;
            auVar87 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar20 << 2)));
            if ((float)local_800._0_4_ < 0.0) {
              local_880._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar20 << 2)));
              fVar253 = sqrtf((float)local_800._0_4_);
              auVar87 = local_880._0_16_;
            }
            auVar87 = vinsertps_avx(ZEXT416(uVar84),auVar87,0x10);
            auVar262 = ZEXT1664(auVar87);
            lVar81 = 5;
            do {
              uVar178 = auVar262._0_4_;
              auVar157._4_4_ = uVar178;
              auVar157._0_4_ = uVar178;
              auVar157._8_4_ = uVar178;
              auVar157._12_4_ = uVar178;
              auVar87 = vfmadd132ps_fma(auVar157,ZEXT816(0) << 0x40,local_7f0);
              local_740 = auVar262._0_32_;
              auVar92 = vmovshdup_avx(auVar262._0_16_);
              fVar232 = auVar92._0_4_;
              fVar231 = 1.0 - fVar232;
              fVar260 = fVar231 * fVar231 * fVar231;
              fVar258 = fVar232 * fVar232;
              fVar233 = fVar258 * fVar232;
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar260),
                                        ZEXT416((uint)fVar233));
              fVar259 = fVar232 * fVar231;
              local_880._0_16_ = ZEXT416((uint)fVar231);
              auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar259 * fVar232 * 6.0)),
                                        ZEXT416((uint)(fVar259 * fVar231)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar233),
                                        ZEXT416((uint)fVar260));
              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar259 * fVar231 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar259 * fVar232)));
              fVar260 = fVar260 * 0.16666667;
              fVar231 = (auVar85._0_4_ + auVar93._0_4_) * 0.16666667;
              fVar232 = (auVar97._0_4_ + auVar86._0_4_) * 0.16666667;
              fVar233 = fVar233 * 0.16666667;
              auVar196._0_4_ = fVar233 * (float)local_7c0._0_4_;
              auVar196._4_4_ = fVar233 * (float)local_7c0._4_4_;
              auVar196._8_4_ = fVar233 * fStack_7b8;
              auVar196._12_4_ = fVar233 * fStack_7b4;
              auVar235._4_4_ = fVar232;
              auVar235._0_4_ = fVar232;
              auVar235._8_4_ = fVar232;
              auVar235._12_4_ = fVar232;
              auVar85 = vfmadd132ps_fma(auVar235,auVar196,local_780._0_16_);
              auVar197._4_4_ = fVar231;
              auVar197._0_4_ = fVar231;
              auVar197._8_4_ = fVar231;
              auVar197._12_4_ = fVar231;
              auVar85 = vfmadd132ps_fma(auVar197,auVar85,local_7a0._0_16_);
              auVar180._4_4_ = fVar260;
              auVar180._0_4_ = fVar260;
              auVar180._8_4_ = fVar260;
              auVar180._12_4_ = fVar260;
              auVar85 = vfmadd132ps_fma(auVar180,auVar85,local_760._0_16_);
              local_600._0_16_ = auVar85;
              auVar85 = vsubps_avx(auVar87,auVar85);
              auVar87 = vdpps_avx(auVar85,auVar85,0x7f);
              local_820._0_16_ = auVar87;
              if (auVar87._0_4_ < 0.0) {
                local_8a0._0_4_ = fVar258;
                local_8c0._0_4_ = fVar259;
                auVar246._0_4_ = sqrtf(auVar87._0_4_);
                auVar246._4_60_ = extraout_var;
                auVar87 = auVar246._0_16_;
                fVar259 = (float)local_8c0._0_4_;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                local_8a0._0_4_ = fVar258;
              }
              local_620._4_4_ = local_880._0_4_;
              local_620._0_4_ = local_620._4_4_;
              fStack_618 = (float)local_620._4_4_;
              fStack_614 = (float)local_620._4_4_;
              auVar93 = vfnmsub213ss_fma(auVar92,auVar92,ZEXT416((uint)(fVar259 * 4.0)));
              auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar259 * 4.0)),local_880._0_16_,
                                        local_880._0_16_);
              fVar258 = (float)local_620._4_4_ * -(float)local_620._4_4_ * 0.5;
              fVar259 = auVar93._0_4_ * 0.5;
              fVar260 = auVar97._0_4_ * 0.5;
              local_8a0._0_4_ = (float)local_8a0._0_4_ * 0.5;
              auVar216._0_4_ = (float)local_8a0._0_4_ * (float)local_7c0._0_4_;
              auVar216._4_4_ = (float)local_8a0._0_4_ * (float)local_7c0._4_4_;
              auVar216._8_4_ = (float)local_8a0._0_4_ * fStack_7b8;
              auVar216._12_4_ = (float)local_8a0._0_4_ * fStack_7b4;
              auVar181._4_4_ = fVar260;
              auVar181._0_4_ = fVar260;
              auVar181._8_4_ = fVar260;
              auVar181._12_4_ = fVar260;
              auVar97 = vfmadd132ps_fma(auVar181,auVar216,local_780._0_16_);
              auVar198._4_4_ = fVar259;
              auVar198._0_4_ = fVar259;
              auVar198._8_4_ = fVar259;
              auVar198._12_4_ = fVar259;
              auVar97 = vfmadd132ps_fma(auVar198,auVar97,local_7a0._0_16_);
              auVar267._4_4_ = fVar258;
              auVar267._0_4_ = fVar258;
              auVar267._8_4_ = fVar258;
              auVar267._12_4_ = fVar258;
              _local_8a0 = vfmadd132ps_fma(auVar267,auVar97,local_760._0_16_);
              local_640._0_16_ = vdpps_avx(_local_8a0,_local_8a0,0x7f);
              auVar57._12_4_ = 0;
              auVar57._0_12_ = ZEXT812(0);
              fVar258 = local_640._0_4_;
              local_850 = vrsqrt14ss_avx512f(auVar57 << 0x20,ZEXT416((uint)fVar258));
              fVar259 = local_850._0_4_;
              local_660._0_16_ = vrcp14ss_avx512f(auVar57 << 0x20,ZEXT416((uint)fVar258));
              auVar97 = vfnmadd213ss_fma(local_660._0_16_,local_640._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar97._0_4_;
              local_8c0._0_4_ = auVar87._0_4_;
              if (fVar258 < -fVar258) {
                fVar260 = sqrtf(fVar258);
                auVar87 = ZEXT416((uint)local_8c0._0_4_);
                auVar97 = _local_8a0;
              }
              else {
                auVar97 = vsqrtss_avx(local_640._0_16_,local_640._0_16_);
                fVar260 = auVar97._0_4_;
                auVar97 = _local_8a0;
              }
              fVar231 = local_850._0_4_;
              fVar258 = fVar259 * 1.5 + fVar258 * -0.5 * fVar231 * fVar231 * fVar231;
              local_850._0_4_ = auVar97._0_4_ * fVar258;
              local_850._4_4_ = auVar97._4_4_ * fVar258;
              local_850._8_4_ = auVar97._8_4_ * fVar258;
              local_850._12_4_ = auVar97._12_4_ * fVar258;
              auVar93 = vdpps_avx(auVar85,local_850,0x7f);
              fVar232 = auVar87._0_4_;
              fVar259 = auVar93._0_4_;
              auVar158._0_4_ = fVar259 * fVar259;
              auVar158._4_4_ = auVar93._4_4_ * auVar93._4_4_;
              auVar158._8_4_ = auVar93._8_4_ * auVar93._8_4_;
              auVar158._12_4_ = auVar93._12_4_ * auVar93._12_4_;
              auVar86 = vsubps_avx(local_820._0_16_,auVar158);
              fVar231 = auVar86._0_4_;
              auVar182._4_12_ = ZEXT812(0) << 0x20;
              auVar182._0_4_ = fVar231;
              auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar182);
              auVar89 = vmulss_avx512f(auVar88,ZEXT416(0x3fc00000));
              auVar90 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
              if (fVar231 < 0.0) {
                local_6b0._0_4_ = fVar260;
                local_6d0._0_4_ = auVar89._0_4_;
                local_6e0._4_4_ = fVar258;
                local_6e0._0_4_ = fVar258;
                fStack_6d8 = fVar258;
                fStack_6d4 = fVar258;
                local_6c0 = auVar88;
                fVar231 = sqrtf(fVar231);
                auVar90 = ZEXT416(auVar90._0_4_);
                auVar89 = ZEXT416((uint)local_6d0._0_4_);
                auVar87 = ZEXT416((uint)local_8c0._0_4_);
                auVar88 = local_6c0;
                auVar97 = _local_8a0;
                fVar258 = (float)local_6e0._0_4_;
                fVar233 = (float)local_6e0._4_4_;
                fVar215 = fStack_6d8;
                fVar234 = fStack_6d4;
                fVar260 = (float)local_6b0._0_4_;
              }
              else {
                auVar86 = vsqrtss_avx(auVar86,auVar86);
                fVar231 = auVar86._0_4_;
                fVar233 = fVar258;
                fVar215 = fVar258;
                fVar234 = fVar258;
              }
              auVar269 = ZEXT1664(auVar97);
              auVar266 = ZEXT1664(local_820._0_16_);
              auVar264 = ZEXT1664(auVar85);
              auVar271 = ZEXT3264(local_8e0);
              auVar272 = ZEXT3264(local_900);
              auVar273 = ZEXT3264(local_920);
              auVar274 = ZEXT3264(local_940);
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_,auVar92);
              auVar94 = vfmadd213ss_fma(auVar92,SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_);
              auVar96 = local_740._0_16_;
              auVar92 = vshufps_avx(auVar96,auVar96,0x55);
              auVar199._0_4_ = auVar92._0_4_ * (float)local_7c0._0_4_;
              auVar199._4_4_ = auVar92._4_4_ * (float)local_7c0._4_4_;
              auVar199._8_4_ = auVar92._8_4_ * fStack_7b8;
              auVar199._12_4_ = auVar92._12_4_ * fStack_7b4;
              auVar217._0_4_ = auVar94._0_4_;
              auVar217._4_4_ = auVar217._0_4_;
              auVar217._8_4_ = auVar217._0_4_;
              auVar217._12_4_ = auVar217._0_4_;
              auVar92 = vfmadd132ps_fma(auVar217,auVar199,local_780._0_16_);
              auVar183._0_4_ = auVar86._0_4_;
              auVar183._4_4_ = auVar183._0_4_;
              auVar183._8_4_ = auVar183._0_4_;
              auVar183._12_4_ = auVar183._0_4_;
              auVar92 = vfmadd132ps_fma(auVar183,auVar92,local_7a0._0_16_);
              auVar92 = vfmadd132ps_fma(_local_620,auVar92,local_760._0_16_);
              auVar184._0_4_ = auVar92._0_4_ * (float)local_640._0_4_;
              auVar184._4_4_ = auVar92._4_4_ * (float)local_640._0_4_;
              auVar184._8_4_ = auVar92._8_4_ * (float)local_640._0_4_;
              auVar184._12_4_ = auVar92._12_4_ * (float)local_640._0_4_;
              auVar92 = vdpps_avx(auVar97,auVar92,0x7f);
              fVar241 = auVar92._0_4_;
              auVar200._0_4_ = auVar97._0_4_ * fVar241;
              auVar200._4_4_ = auVar97._4_4_ * fVar241;
              auVar200._8_4_ = auVar97._8_4_ * fVar241;
              auVar200._12_4_ = auVar97._12_4_ * fVar241;
              auVar92 = vsubps_avx(auVar184,auVar200);
              fVar241 = (float)local_840._0_4_ * (float)local_660._0_4_;
              auVar94 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                   ZEXT416((uint)(local_740._0_4_ * fVar253 * 1.9073486e-06)));
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar91 = vxorps_avx512vl(auVar97,auVar21);
              auVar201._0_4_ = fVar258 * auVar92._0_4_ * fVar241;
              auVar201._4_4_ = fVar233 * auVar92._4_4_ * fVar241;
              auVar201._8_4_ = fVar215 * auVar92._8_4_ * fVar241;
              auVar201._12_4_ = fVar234 * auVar92._12_4_ * fVar241;
              auVar92 = vdpps_avx(auVar91,local_850,0x7f);
              auVar86 = vfmadd213ss_fma(auVar87,ZEXT416((uint)local_860._0_4_),auVar94);
              auVar87 = vdpps_avx(auVar85,auVar201,0x7f);
              auVar95 = vfmadd213ss_fma(ZEXT416((uint)(fVar232 + 1.0)),
                                        ZEXT416((uint)((float)local_860._0_4_ / fVar260)),auVar86);
              fVar258 = auVar92._0_4_ + auVar87._0_4_;
              auVar87 = vdpps_avx(local_7f0,local_850,0x7f);
              auVar92 = vdpps_avx(auVar85,auVar91,0x7f);
              auVar86 = vmulss_avx512f(auVar90,auVar88);
              auVar90 = vaddss_avx512f(auVar89,ZEXT416((uint)(auVar86._0_4_ *
                                                             auVar88._0_4_ * auVar88._0_4_)));
              auVar86 = vdpps_avx(auVar85,local_7f0,0x7f);
              auVar89 = vfnmadd231ss_fma(auVar92,auVar93,ZEXT416((uint)fVar258));
              auVar86 = vfnmadd231ss_fma(auVar86,auVar93,auVar87);
              auVar92 = vpermilps_avx(local_600._0_16_,0xff);
              fVar231 = fVar231 - auVar92._0_4_;
              auVar88 = vshufps_avx(auVar97,auVar97,0xff);
              auVar92 = vfmsub213ss_fma(auVar89,auVar90,auVar88);
              auVar254._8_4_ = 0x80000000;
              auVar254._0_8_ = 0x8000000080000000;
              auVar254._12_4_ = 0x80000000;
              auVar257 = ZEXT1664(auVar254);
              auVar249._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
              auVar249._8_4_ = auVar92._8_4_ ^ 0x80000000;
              auVar249._12_4_ = auVar92._12_4_ ^ 0x80000000;
              auVar252 = ZEXT1664(auVar249);
              auVar86 = ZEXT416((uint)(auVar86._0_4_ * auVar90._0_4_));
              auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar87._0_4_ * auVar92._0_4_)),
                                        ZEXT416((uint)fVar258),auVar86);
              auVar92 = vinsertps_avx(auVar249,auVar86,0x1c);
              auVar244._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
              auVar244._8_4_ = auVar87._8_4_ ^ 0x80000000;
              auVar244._12_4_ = auVar87._12_4_ ^ 0x80000000;
              auVar86 = vinsertps_avx(ZEXT416((uint)fVar258),auVar244,0x10);
              auVar218._0_4_ = auVar89._0_4_;
              auVar218._4_4_ = auVar218._0_4_;
              auVar218._8_4_ = auVar218._0_4_;
              auVar218._12_4_ = auVar218._0_4_;
              auVar87 = vdivps_avx(auVar92,auVar218);
              auVar92 = vdivps_avx(auVar86,auVar218);
              auVar219._0_4_ = fVar259 * auVar87._0_4_ + fVar231 * auVar92._0_4_;
              auVar219._4_4_ = fVar259 * auVar87._4_4_ + fVar231 * auVar92._4_4_;
              auVar219._8_4_ = fVar259 * auVar87._8_4_ + fVar231 * auVar92._8_4_;
              auVar219._12_4_ = fVar259 * auVar87._12_4_ + fVar231 * auVar92._12_4_;
              auVar87 = vsubps_avx(auVar96,auVar219);
              auVar262 = ZEXT1664(auVar87);
              auVar22._8_4_ = 0x7fffffff;
              auVar22._0_8_ = 0x7fffffff7fffffff;
              auVar22._12_4_ = 0x7fffffff;
              auVar92 = vandps_avx512vl(auVar93,auVar22);
              if (auVar92._0_4_ < auVar95._0_4_) {
                auVar92 = vfmadd231ss_fma(ZEXT416((uint)(auVar95._0_4_ + auVar94._0_4_)),local_6f0,
                                          ZEXT416(0x36000000));
                auVar23._8_4_ = 0x7fffffff;
                auVar23._0_8_ = 0x7fffffff7fffffff;
                auVar23._12_4_ = 0x7fffffff;
                auVar93 = vandps_avx512vl(ZEXT416((uint)fVar231),auVar23);
                if (auVar93._0_4_ < auVar92._0_4_) {
                  fVar253 = auVar87._0_4_ + (float)local_700._0_4_;
                  if ((fVar253 < fVar155) ||
                     (fVar258 = *(float *)(ray + k * 4 + 0x100), fVar258 < fVar253)) break;
                  auVar92 = vmovshdup_avx(auVar87);
                  fVar259 = auVar92._0_4_;
                  if ((fVar259 < 0.0) || (1.0 < fVar259)) break;
                  auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_820._0_4_));
                  fVar260 = auVar92._0_4_;
                  pGVar4 = (context->scene->geometries).items[uVar78].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                  fVar260 = fVar260 * 1.5 + local_820._0_4_ * -0.5 * fVar260 * fVar260 * fVar260;
                  auVar220._0_4_ = auVar85._0_4_ * fVar260;
                  auVar220._4_4_ = auVar85._4_4_ * fVar260;
                  auVar220._8_4_ = auVar85._8_4_ * fVar260;
                  auVar220._12_4_ = auVar85._12_4_ * fVar260;
                  auVar88 = vfmadd213ps_fma(auVar88,auVar220,auVar97);
                  auVar92 = vshufps_avx(auVar220,auVar220,0xc9);
                  auVar93 = vshufps_avx(auVar97,auVar97,0xc9);
                  auVar221._0_4_ = auVar220._0_4_ * auVar93._0_4_;
                  auVar221._4_4_ = auVar220._4_4_ * auVar93._4_4_;
                  auVar221._8_4_ = auVar220._8_4_ * auVar93._8_4_;
                  auVar221._12_4_ = auVar220._12_4_ * auVar93._12_4_;
                  auVar86 = vfmsub231ps_fma(auVar221,auVar97,auVar92);
                  auVar92 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar93 = vshufps_avx(auVar88,auVar88,0xc9);
                  auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                  auVar159._0_4_ = auVar88._0_4_ * auVar86._0_4_;
                  auVar159._4_4_ = auVar88._4_4_ * auVar86._4_4_;
                  auVar159._8_4_ = auVar88._8_4_ * auVar86._8_4_;
                  auVar159._12_4_ = auVar88._12_4_ * auVar86._12_4_;
                  auVar92 = vfmsub231ps_fma(auVar159,auVar92,auVar93);
                  uVar178 = auVar92._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar253;
                    uVar3 = vextractps_avx(auVar92,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                    uVar3 = vextractps_avx(auVar92,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar178;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar259;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(undefined4 *)(ray + k * 4 + 0x220) = uVar1;
                    *(uint *)(ray + k * 4 + 0x240) = uVar78;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar5 = context->user;
                  auVar229._8_4_ = 1;
                  auVar229._0_8_ = 0x100000001;
                  auVar229._12_4_ = 1;
                  auVar229._16_4_ = 1;
                  auVar229._20_4_ = 1;
                  auVar229._24_4_ = 1;
                  auVar229._28_4_ = 1;
                  local_440 = vpermps_avx2(auVar229,ZEXT1632(auVar87));
                  auVar109 = vpermps_avx2(auVar229,ZEXT1632(auVar92));
                  auVar239._8_4_ = 2;
                  auVar239._0_8_ = 0x200000002;
                  auVar239._12_4_ = 2;
                  auVar239._16_4_ = 2;
                  auVar239._20_4_ = 2;
                  auVar239._24_4_ = 2;
                  auVar239._28_4_ = 2;
                  local_480 = vpermps_avx2(auVar239,ZEXT1632(auVar92));
                  local_4a0[0] = (RTCHitN)auVar109[0];
                  local_4a0[1] = (RTCHitN)auVar109[1];
                  local_4a0[2] = (RTCHitN)auVar109[2];
                  local_4a0[3] = (RTCHitN)auVar109[3];
                  local_4a0[4] = (RTCHitN)auVar109[4];
                  local_4a0[5] = (RTCHitN)auVar109[5];
                  local_4a0[6] = (RTCHitN)auVar109[6];
                  local_4a0[7] = (RTCHitN)auVar109[7];
                  local_4a0[8] = (RTCHitN)auVar109[8];
                  local_4a0[9] = (RTCHitN)auVar109[9];
                  local_4a0[10] = (RTCHitN)auVar109[10];
                  local_4a0[0xb] = (RTCHitN)auVar109[0xb];
                  local_4a0[0xc] = (RTCHitN)auVar109[0xc];
                  local_4a0[0xd] = (RTCHitN)auVar109[0xd];
                  local_4a0[0xe] = (RTCHitN)auVar109[0xe];
                  local_4a0[0xf] = (RTCHitN)auVar109[0xf];
                  local_4a0[0x10] = (RTCHitN)auVar109[0x10];
                  local_4a0[0x11] = (RTCHitN)auVar109[0x11];
                  local_4a0[0x12] = (RTCHitN)auVar109[0x12];
                  local_4a0[0x13] = (RTCHitN)auVar109[0x13];
                  local_4a0[0x14] = (RTCHitN)auVar109[0x14];
                  local_4a0[0x15] = (RTCHitN)auVar109[0x15];
                  local_4a0[0x16] = (RTCHitN)auVar109[0x16];
                  local_4a0[0x17] = (RTCHitN)auVar109[0x17];
                  local_4a0[0x18] = (RTCHitN)auVar109[0x18];
                  local_4a0[0x19] = (RTCHitN)auVar109[0x19];
                  local_4a0[0x1a] = (RTCHitN)auVar109[0x1a];
                  local_4a0[0x1b] = (RTCHitN)auVar109[0x1b];
                  local_4a0[0x1c] = (RTCHitN)auVar109[0x1c];
                  local_4a0[0x1d] = (RTCHitN)auVar109[0x1d];
                  local_4a0[0x1e] = (RTCHitN)auVar109[0x1e];
                  local_4a0[0x1f] = (RTCHitN)auVar109[0x1f];
                  local_460 = uVar178;
                  uStack_45c = uVar178;
                  uStack_458 = uVar178;
                  uStack_454 = uVar178;
                  uStack_450 = uVar178;
                  uStack_44c = uVar178;
                  uStack_448 = uVar178;
                  uStack_444 = uVar178;
                  local_420 = ZEXT432(0) << 0x20;
                  local_400 = local_4e0._0_8_;
                  uStack_3f8 = local_4e0._8_8_;
                  uStack_3f0 = local_4e0._16_8_;
                  uStack_3e8 = local_4e0._24_8_;
                  local_3e0 = local_4c0;
                  auVar109 = vpcmpeqd_avx2(local_4c0,local_4c0);
                  local_828[1] = auVar109;
                  *local_828 = auVar109;
                  local_3c0 = pRVar5->instID[0];
                  uStack_3bc = local_3c0;
                  uStack_3b8 = local_3c0;
                  uStack_3b4 = local_3c0;
                  uStack_3b0 = local_3c0;
                  uStack_3ac = local_3c0;
                  uStack_3a8 = local_3c0;
                  uStack_3a4 = local_3c0;
                  local_3a0 = pRVar5->instPrimID[0];
                  uStack_39c = local_3a0;
                  uStack_398 = local_3a0;
                  uStack_394 = local_3a0;
                  uStack_390 = local_3a0;
                  uStack_38c = local_3a0;
                  uStack_388 = local_3a0;
                  uStack_384 = local_3a0;
                  *(float *)(ray + k * 4 + 0x100) = fVar253;
                  local_720 = local_520;
                  local_970.valid = (int *)local_720;
                  local_970.geometryUserPtr = pGVar4->userPtr;
                  local_970.context = context->user;
                  local_970.hit = local_4a0;
                  local_970.N = 8;
                  local_970.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar252 = ZEXT1664(auVar249);
                    auVar257 = ZEXT1664(auVar254);
                    auVar262 = ZEXT1664(auVar87);
                    auVar264 = ZEXT1664(auVar85);
                    auVar266 = ZEXT1664(local_820._0_16_);
                    auVar269 = ZEXT1664(auVar97);
                    (*pGVar4->intersectionFilterN)(&local_970);
                    auVar274 = ZEXT3264(local_940);
                    auVar273 = ZEXT3264(local_920);
                    auVar272 = ZEXT3264(local_900);
                    auVar271 = ZEXT3264(local_8e0);
                  }
                  if (local_720 != (undefined1  [32])0x0) {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar252 = ZEXT1664(auVar252._0_16_);
                      auVar257 = ZEXT1664(auVar257._0_16_);
                      auVar262 = ZEXT1664(auVar262._0_16_);
                      auVar264 = ZEXT1664(auVar264._0_16_);
                      auVar266 = ZEXT1664(auVar266._0_16_);
                      auVar269 = ZEXT1664(auVar269._0_16_);
                      (*p_Var6)(&local_970);
                      auVar274 = ZEXT3264(local_940);
                      auVar273 = ZEXT3264(local_920);
                      auVar272 = ZEXT3264(local_900);
                      auVar271 = ZEXT3264(local_8e0);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      uVar82 = vptestmd_avx512vl(local_720,local_720);
                      iVar59 = *(int *)(local_970.hit + 4);
                      iVar60 = *(int *)(local_970.hit + 8);
                      iVar61 = *(int *)(local_970.hit + 0xc);
                      iVar62 = *(int *)(local_970.hit + 0x10);
                      iVar63 = *(int *)(local_970.hit + 0x14);
                      iVar64 = *(int *)(local_970.hit + 0x18);
                      iVar65 = *(int *)(local_970.hit + 0x1c);
                      bVar72 = (byte)uVar82;
                      bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar13 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_970.ray + 0x180) =
                           (uint)(bVar72 & 1) * *(int *)local_970.hit |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_970.ray + 0x180);
                      *(uint *)(local_970.ray + 0x184) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x184);
                      *(uint *)(local_970.ray + 0x188) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x188);
                      *(uint *)(local_970.ray + 0x18c) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x18c);
                      *(uint *)(local_970.ray + 400) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 400);
                      *(uint *)(local_970.ray + 0x194) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 0x194);
                      *(uint *)(local_970.ray + 0x198) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x198);
                      *(uint *)(local_970.ray + 0x19c) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x19c);
                      iVar59 = *(int *)(local_970.hit + 0x24);
                      iVar60 = *(int *)(local_970.hit + 0x28);
                      iVar61 = *(int *)(local_970.hit + 0x2c);
                      iVar62 = *(int *)(local_970.hit + 0x30);
                      iVar63 = *(int *)(local_970.hit + 0x34);
                      iVar64 = *(int *)(local_970.hit + 0x38);
                      iVar65 = *(int *)(local_970.hit + 0x3c);
                      bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar13 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_970.ray + 0x1a0) =
                           (uint)(bVar72 & 1) * *(int *)(local_970.hit + 0x20) |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_970.ray + 0x1a0);
                      *(uint *)(local_970.ray + 0x1a4) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x1a4);
                      *(uint *)(local_970.ray + 0x1a8) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x1a8);
                      *(uint *)(local_970.ray + 0x1ac) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x1ac);
                      *(uint *)(local_970.ray + 0x1b0) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 0x1b0);
                      *(uint *)(local_970.ray + 0x1b4) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 0x1b4);
                      *(uint *)(local_970.ray + 0x1b8) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x1b8);
                      *(uint *)(local_970.ray + 0x1bc) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x1bc);
                      iVar59 = *(int *)(local_970.hit + 0x44);
                      iVar60 = *(int *)(local_970.hit + 0x48);
                      iVar61 = *(int *)(local_970.hit + 0x4c);
                      iVar62 = *(int *)(local_970.hit + 0x50);
                      iVar63 = *(int *)(local_970.hit + 0x54);
                      iVar64 = *(int *)(local_970.hit + 0x58);
                      iVar65 = *(int *)(local_970.hit + 0x5c);
                      bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar13 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_970.ray + 0x1c0) =
                           (uint)(bVar72 & 1) * *(int *)(local_970.hit + 0x40) |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_970.ray + 0x1c0);
                      *(uint *)(local_970.ray + 0x1c4) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x1c4);
                      *(uint *)(local_970.ray + 0x1c8) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x1c8);
                      *(uint *)(local_970.ray + 0x1cc) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x1cc);
                      *(uint *)(local_970.ray + 0x1d0) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 0x1d0);
                      *(uint *)(local_970.ray + 0x1d4) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 0x1d4);
                      *(uint *)(local_970.ray + 0x1d8) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x1d8);
                      *(uint *)(local_970.ray + 0x1dc) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x1dc);
                      iVar59 = *(int *)(local_970.hit + 100);
                      iVar60 = *(int *)(local_970.hit + 0x68);
                      iVar61 = *(int *)(local_970.hit + 0x6c);
                      iVar62 = *(int *)(local_970.hit + 0x70);
                      iVar63 = *(int *)(local_970.hit + 0x74);
                      iVar64 = *(int *)(local_970.hit + 0x78);
                      iVar65 = *(int *)(local_970.hit + 0x7c);
                      bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar13 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_970.ray + 0x1e0) =
                           (uint)(bVar72 & 1) * *(int *)(local_970.hit + 0x60) |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_970.ray + 0x1e0);
                      *(uint *)(local_970.ray + 0x1e4) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x1e4);
                      *(uint *)(local_970.ray + 0x1e8) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x1e8);
                      *(uint *)(local_970.ray + 0x1ec) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x1ec);
                      *(uint *)(local_970.ray + 0x1f0) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 0x1f0);
                      *(uint *)(local_970.ray + 500) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 500);
                      *(uint *)(local_970.ray + 0x1f8) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x1f8);
                      *(uint *)(local_970.ray + 0x1fc) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x1fc);
                      iVar59 = *(int *)(local_970.hit + 0x84);
                      iVar60 = *(int *)(local_970.hit + 0x88);
                      iVar61 = *(int *)(local_970.hit + 0x8c);
                      iVar62 = *(int *)(local_970.hit + 0x90);
                      iVar63 = *(int *)(local_970.hit + 0x94);
                      iVar64 = *(int *)(local_970.hit + 0x98);
                      iVar65 = *(int *)(local_970.hit + 0x9c);
                      bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar13 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_970.ray + 0x200) =
                           (uint)(bVar72 & 1) * *(int *)(local_970.hit + 0x80) |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_970.ray + 0x200);
                      *(uint *)(local_970.ray + 0x204) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x204);
                      *(uint *)(local_970.ray + 0x208) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x208);
                      *(uint *)(local_970.ray + 0x20c) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x20c);
                      *(uint *)(local_970.ray + 0x210) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 0x210);
                      *(uint *)(local_970.ray + 0x214) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 0x214);
                      *(uint *)(local_970.ray + 0x218) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x218);
                      *(uint *)(local_970.ray + 0x21c) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x21c);
                      auVar109 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_970.hit + 0xa0));
                      *(undefined1 (*) [32])(local_970.ray + 0x220) = auVar109;
                      auVar109 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_970.hit + 0xc0));
                      *(undefined1 (*) [32])(local_970.ray + 0x240) = auVar109;
                      auVar109 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_970.hit + 0xe0));
                      *(undefined1 (*) [32])(local_970.ray + 0x260) = auVar109;
                      auVar109 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_970.hit + 0x100));
                      *(undefined1 (*) [32])(local_970.ray + 0x280) = auVar109;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar258;
                  break;
                }
              }
              lVar81 = lVar81 + -1;
            } while (lVar81 != 0);
            uVar178 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar170._4_4_ = uVar178;
            auVar170._0_4_ = uVar178;
            auVar170._8_4_ = uVar178;
            auVar170._12_4_ = uVar178;
            auVar170._16_4_ = uVar178;
            auVar170._20_4_ = uVar178;
            auVar170._24_4_ = uVar178;
            auVar170._28_4_ = uVar178;
            auVar66._4_4_ = fStack_55c;
            auVar66._0_4_ = local_560;
            auVar66._8_4_ = fStack_558;
            auVar66._12_4_ = fStack_554;
            auVar66._16_4_ = fStack_550;
            auVar66._20_4_ = fStack_54c;
            auVar66._24_4_ = fStack_548;
            auVar66._28_4_ = fStack_544;
            uVar17 = vcmpps_avx512vl(auVar170,auVar66,0xd);
            bVar80 = ~('\x01' << ((byte)iVar20 & 0x1f)) & bVar80 & (byte)uVar17;
          } while (bVar80 != 0);
          auVar246 = ZEXT3264(local_340);
        }
        bVar75 = local_580[0] | ~bVar75;
        auVar192._0_4_ = (float)local_7e0._0_4_ + auVar246._0_4_;
        auVar192._4_4_ = (float)local_7e0._4_4_ + auVar246._4_4_;
        auVar192._8_4_ = fStack_7d8 + auVar246._8_4_;
        auVar192._12_4_ = fStack_7d4 + auVar246._12_4_;
        auVar192._16_4_ = fStack_7d0 + auVar246._16_4_;
        auVar192._20_4_ = fStack_7cc + auVar246._20_4_;
        auVar192._24_4_ = fStack_7c8 + auVar246._24_4_;
        auVar192._28_4_ = fStack_7c4 + auVar246._28_4_;
        uVar17 = vcmpps_avx512vl(auVar192,auVar170,2);
        bVar70 = (byte)uVar18 & bVar70 & (byte)uVar17;
        auVar193._8_4_ = 2;
        auVar193._0_8_ = 0x200000002;
        auVar193._12_4_ = 2;
        auVar193._16_4_ = 2;
        auVar193._20_4_ = 2;
        auVar193._24_4_ = 2;
        auVar193._28_4_ = 2;
        auVar30._8_4_ = 3;
        auVar30._0_8_ = 0x300000003;
        auVar30._12_4_ = 3;
        auVar30._16_4_ = 3;
        auVar30._20_4_ = 3;
        auVar30._24_4_ = 3;
        auVar30._28_4_ = 3;
        auVar109 = vpblendmd_avx512vl(auVar193,auVar30);
        auVar145._0_4_ = (uint)(bVar75 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar75 & 1) * 2;
        bVar7 = (bool)(bVar75 >> 1 & 1);
        auVar145._4_4_ = (uint)bVar7 * auVar109._4_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar75 >> 2 & 1);
        auVar145._8_4_ = (uint)bVar7 * auVar109._8_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar75 >> 3 & 1);
        auVar145._12_4_ = (uint)bVar7 * auVar109._12_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar75 >> 4 & 1);
        auVar145._16_4_ = (uint)bVar7 * auVar109._16_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar75 >> 5 & 1);
        auVar145._20_4_ = (uint)bVar7 * auVar109._20_4_ | (uint)!bVar7 * 2;
        bVar7 = (bool)(bVar75 >> 6 & 1);
        auVar145._24_4_ = (uint)bVar7 * auVar109._24_4_ | (uint)!bVar7 * 2;
        auVar145._28_4_ = (uint)(bVar75 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar75 >> 7) * 2;
        uVar17 = vpcmpd_avx512vl(local_500,auVar145,5);
        bVar75 = (byte)uVar17 & bVar70;
        fVar253 = (float)local_7e0._0_4_;
        fVar258 = (float)local_7e0._4_4_;
        fVar259 = fStack_7d8;
        fVar260 = fStack_7d4;
        fVar231 = fStack_7d0;
        fVar232 = fStack_7cc;
        fVar233 = fStack_7c8;
        fVar215 = fStack_7c4;
        if (bVar75 != 0) {
          auVar92 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar87 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar85 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar97 = vminps_avx(auVar92,auVar85);
          auVar92 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar85 = vmaxps_avx(auVar87,auVar92);
          auVar202._8_4_ = 0x7fffffff;
          auVar202._0_8_ = 0x7fffffff7fffffff;
          auVar202._12_4_ = 0x7fffffff;
          auVar87 = vandps_avx(auVar97,auVar202);
          auVar92 = vandps_avx(auVar85,auVar202);
          auVar87 = vmaxps_avx(auVar87,auVar92);
          auVar92 = vmovshdup_avx(auVar87);
          auVar92 = vmaxss_avx(auVar92,auVar87);
          auVar87 = vshufpd_avx(auVar87,auVar87,1);
          auVar87 = vmaxss_avx(auVar87,auVar92);
          fVar253 = auVar87._0_4_ * 1.9073486e-06;
          local_6f0 = vshufps_avx(auVar85,auVar85,0xff);
          local_560 = (float)local_7e0._0_4_ + local_380._0_4_;
          fStack_55c = (float)local_7e0._4_4_ + local_380._4_4_;
          fStack_558 = fStack_7d8 + local_380._8_4_;
          fStack_554 = fStack_7d4 + local_380._12_4_;
          fStack_550 = fStack_7d0 + local_380._16_4_;
          fStack_54c = fStack_7cc + local_380._20_4_;
          fStack_548 = fStack_7c8 + local_380._24_4_;
          fStack_544 = fStack_7c4 + local_380._28_4_;
          _local_680 = local_380;
          local_580 = auVar145;
          do {
            auVar171._8_4_ = 0x7f800000;
            auVar171._0_8_ = 0x7f8000007f800000;
            auVar171._12_4_ = 0x7f800000;
            auVar171._16_4_ = 0x7f800000;
            auVar171._20_4_ = 0x7f800000;
            auVar171._24_4_ = 0x7f800000;
            auVar171._28_4_ = 0x7f800000;
            auVar109 = vblendmps_avx512vl(auVar171,_local_680);
            auVar146._0_4_ =
                 (uint)(bVar75 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar75 & 1) * 0x7f800000;
            bVar7 = (bool)(bVar75 >> 1 & 1);
            auVar146._4_4_ = (uint)bVar7 * auVar109._4_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar75 >> 2 & 1);
            auVar146._8_4_ = (uint)bVar7 * auVar109._8_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar75 >> 3 & 1);
            auVar146._12_4_ = (uint)bVar7 * auVar109._12_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar75 >> 4 & 1);
            auVar146._16_4_ = (uint)bVar7 * auVar109._16_4_ | (uint)!bVar7 * 0x7f800000;
            bVar7 = (bool)(bVar75 >> 5 & 1);
            auVar146._20_4_ = (uint)bVar7 * auVar109._20_4_ | (uint)!bVar7 * 0x7f800000;
            auVar146._24_4_ =
                 (uint)(bVar75 >> 6) * auVar109._24_4_ | (uint)!(bool)(bVar75 >> 6) * 0x7f800000;
            auVar146._28_4_ = 0x7f800000;
            auVar109 = vshufps_avx(auVar146,auVar146,0xb1);
            auVar109 = vminps_avx(auVar146,auVar109);
            auVar110 = vshufpd_avx(auVar109,auVar109,5);
            auVar109 = vminps_avx(auVar109,auVar110);
            auVar110 = vpermpd_avx2(auVar109,0x4e);
            auVar109 = vminps_avx(auVar109,auVar110);
            uVar17 = vcmpps_avx512vl(auVar146,auVar109,0);
            bVar72 = (byte)uVar17 & bVar75;
            bVar80 = bVar75;
            if (bVar72 != 0) {
              bVar80 = bVar72;
            }
            iVar20 = 0;
            for (uVar84 = (uint)bVar80; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            uVar84 = *(uint *)(local_360 + (uint)(iVar20 << 2));
            fVar258 = auVar15._0_4_;
            auVar87 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar20 << 2)));
            if ((float)local_800._0_4_ < 0.0) {
              local_880._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar20 << 2)));
              fVar258 = sqrtf((float)local_800._0_4_);
              auVar87 = local_880._0_16_;
            }
            local_850._0_4_ = fVar258 * 1.9073486e-06;
            auVar87 = vinsertps_avx(ZEXT416(uVar84),auVar87,0x10);
            auVar262 = ZEXT1664(auVar87);
            lVar81 = 5;
            do {
              uVar178 = auVar262._0_4_;
              auVar160._4_4_ = uVar178;
              auVar160._0_4_ = uVar178;
              auVar160._8_4_ = uVar178;
              auVar160._12_4_ = uVar178;
              auVar87 = vfmadd132ps_fma(auVar160,ZEXT816(0) << 0x40,local_7f0);
              local_740 = auVar262._0_32_;
              auVar92 = vmovshdup_avx(auVar262._0_16_);
              fVar232 = auVar92._0_4_;
              fVar231 = 1.0 - fVar232;
              fVar260 = fVar231 * fVar231 * fVar231;
              fVar258 = fVar232 * fVar232;
              fVar233 = fVar258 * fVar232;
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar260),
                                        ZEXT416((uint)fVar233));
              fVar259 = fVar232 * fVar231;
              local_880._0_16_ = ZEXT416((uint)fVar231);
              auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar259 * fVar232 * 6.0)),
                                        ZEXT416((uint)(fVar259 * fVar231)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar233),
                                        ZEXT416((uint)fVar260));
              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar259 * fVar231 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar259 * fVar232)));
              fVar260 = fVar260 * 0.16666667;
              fVar231 = (auVar85._0_4_ + auVar93._0_4_) * 0.16666667;
              fVar232 = (auVar97._0_4_ + auVar86._0_4_) * 0.16666667;
              fVar233 = fVar233 * 0.16666667;
              auVar203._0_4_ = fVar233 * (float)local_7c0._0_4_;
              auVar203._4_4_ = fVar233 * (float)local_7c0._4_4_;
              auVar203._8_4_ = fVar233 * fStack_7b8;
              auVar203._12_4_ = fVar233 * fStack_7b4;
              auVar236._4_4_ = fVar232;
              auVar236._0_4_ = fVar232;
              auVar236._8_4_ = fVar232;
              auVar236._12_4_ = fVar232;
              auVar85 = vfmadd132ps_fma(auVar236,auVar203,local_780._0_16_);
              auVar204._4_4_ = fVar231;
              auVar204._0_4_ = fVar231;
              auVar204._8_4_ = fVar231;
              auVar204._12_4_ = fVar231;
              auVar85 = vfmadd132ps_fma(auVar204,auVar85,local_7a0._0_16_);
              auVar185._4_4_ = fVar260;
              auVar185._0_4_ = fVar260;
              auVar185._8_4_ = fVar260;
              auVar185._12_4_ = fVar260;
              auVar85 = vfmadd132ps_fma(auVar185,auVar85,local_760._0_16_);
              local_600._0_16_ = auVar85;
              auVar85 = vsubps_avx(auVar87,auVar85);
              auVar87 = vdpps_avx(auVar85,auVar85,0x7f);
              local_820._0_16_ = auVar87;
              if (auVar87._0_4_ < 0.0) {
                local_8a0._0_4_ = fVar258;
                local_8c0._0_4_ = fVar259;
                auVar257._0_4_ = sqrtf(auVar87._0_4_);
                auVar257._4_60_ = extraout_var_00;
                auVar87 = auVar257._0_16_;
                fVar259 = (float)local_8c0._0_4_;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                local_8a0._0_4_ = fVar258;
              }
              local_620._4_4_ = local_880._0_4_;
              local_620._0_4_ = local_620._4_4_;
              fStack_618 = (float)local_620._4_4_;
              fStack_614 = (float)local_620._4_4_;
              auVar93 = vfnmsub213ss_fma(auVar92,auVar92,ZEXT416((uint)(fVar259 * 4.0)));
              auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar259 * 4.0)),local_880._0_16_,
                                        local_880._0_16_);
              fVar258 = (float)local_620._4_4_ * -(float)local_620._4_4_ * 0.5;
              fVar259 = auVar93._0_4_ * 0.5;
              fVar260 = auVar97._0_4_ * 0.5;
              local_8a0._0_4_ = (float)local_8a0._0_4_ * 0.5;
              auVar222._0_4_ = (float)local_8a0._0_4_ * (float)local_7c0._0_4_;
              auVar222._4_4_ = (float)local_8a0._0_4_ * (float)local_7c0._4_4_;
              auVar222._8_4_ = (float)local_8a0._0_4_ * fStack_7b8;
              auVar222._12_4_ = (float)local_8a0._0_4_ * fStack_7b4;
              auVar186._4_4_ = fVar260;
              auVar186._0_4_ = fVar260;
              auVar186._8_4_ = fVar260;
              auVar186._12_4_ = fVar260;
              auVar97 = vfmadd132ps_fma(auVar186,auVar222,local_780._0_16_);
              auVar205._4_4_ = fVar259;
              auVar205._0_4_ = fVar259;
              auVar205._8_4_ = fVar259;
              auVar205._12_4_ = fVar259;
              auVar97 = vfmadd132ps_fma(auVar205,auVar97,local_7a0._0_16_);
              auVar268._4_4_ = fVar258;
              auVar268._0_4_ = fVar258;
              auVar268._8_4_ = fVar258;
              auVar268._12_4_ = fVar258;
              _local_8a0 = vfmadd132ps_fma(auVar268,auVar97,local_760._0_16_);
              local_640._0_16_ = vdpps_avx(_local_8a0,_local_8a0,0x7f);
              auVar58._12_4_ = 0;
              auVar58._0_12_ = ZEXT812(0);
              fVar258 = local_640._0_4_;
              auVar93 = vrsqrt14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar258));
              local_660._0_16_ = vrcp14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar258));
              auVar97 = vfnmadd213ss_fma(local_660._0_16_,local_640._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar97._0_4_;
              local_8c0._0_4_ = auVar87._0_4_;
              if (fVar258 < -fVar258) {
                local_860 = auVar93;
                fVar259 = sqrtf(fVar258);
                auVar87 = ZEXT416((uint)local_8c0._0_4_);
                auVar97 = local_860;
                auVar86 = _local_8a0;
              }
              else {
                auVar97 = vsqrtss_avx(local_640._0_16_,local_640._0_16_);
                fVar259 = auVar97._0_4_;
                auVar97 = auVar93;
                auVar86 = _local_8a0;
              }
              fVar260 = auVar97._0_4_;
              auVar90 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(auVar93._0_4_ * 1.5 +
                                                 fVar258 * -0.5 * fVar260 * fVar260 * fVar260)));
              auVar89 = vmulps_avx512vl(auVar86,auVar90);
              auVar97 = vdpps_avx(auVar85,auVar89,0x7f);
              fVar258 = auVar87._0_4_ + 1.0;
              fVar260 = auVar97._0_4_;
              auVar161._0_4_ = fVar260 * fVar260;
              auVar161._4_4_ = auVar97._4_4_ * auVar97._4_4_;
              auVar161._8_4_ = auVar97._8_4_ * auVar97._8_4_;
              auVar161._12_4_ = auVar97._12_4_ * auVar97._12_4_;
              auVar93 = vsubps_avx(local_820._0_16_,auVar161);
              fVar231 = auVar93._0_4_;
              auVar187._4_12_ = ZEXT812(0) << 0x20;
              auVar187._0_4_ = fVar231;
              auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
              auVar94 = vmulss_avx512f(auVar88,ZEXT416(0x3fc00000));
              auVar95 = vmulss_avx512f(auVar93,ZEXT416(0xbf000000));
              if (fVar231 < 0.0) {
                local_860._0_4_ = fVar258;
                local_6c0._0_4_ = auVar94._0_4_;
                _local_6e0 = auVar90;
                local_6d0 = auVar89;
                local_6b0 = auVar88;
                fVar231 = sqrtf(fVar231);
                auVar95 = ZEXT416(auVar95._0_4_);
                auVar94 = ZEXT416((uint)local_6c0._0_4_);
                auVar87 = ZEXT416((uint)local_8c0._0_4_);
                auVar88 = local_6b0;
                auVar86 = _local_8a0;
                fVar258 = (float)local_860._0_4_;
                auVar89 = local_6d0;
                auVar90 = _local_6e0;
              }
              else {
                auVar93 = vsqrtss_avx(auVar93,auVar93);
                fVar231 = auVar93._0_4_;
              }
              auVar269 = ZEXT1664(auVar86);
              auVar266 = ZEXT1664(local_820._0_16_);
              auVar264 = ZEXT1664(auVar85);
              auVar271 = ZEXT3264(local_8e0);
              auVar272 = ZEXT3264(local_900);
              auVar273 = ZEXT3264(local_920);
              auVar274 = ZEXT3264(local_940);
              auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_,auVar92);
              auVar91 = vfmadd213ss_fma(auVar92,SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_);
              auVar261 = local_740._0_16_;
              auVar92 = vshufps_avx(auVar261,auVar261,0x55);
              auVar206._0_4_ = auVar92._0_4_ * (float)local_7c0._0_4_;
              auVar206._4_4_ = auVar92._4_4_ * (float)local_7c0._4_4_;
              auVar206._8_4_ = auVar92._8_4_ * fStack_7b8;
              auVar206._12_4_ = auVar92._12_4_ * fStack_7b4;
              auVar223._0_4_ = auVar91._0_4_;
              auVar223._4_4_ = auVar223._0_4_;
              auVar223._8_4_ = auVar223._0_4_;
              auVar223._12_4_ = auVar223._0_4_;
              auVar92 = vfmadd132ps_fma(auVar223,auVar206,local_780._0_16_);
              auVar188._0_4_ = auVar93._0_4_;
              auVar188._4_4_ = auVar188._0_4_;
              auVar188._8_4_ = auVar188._0_4_;
              auVar188._12_4_ = auVar188._0_4_;
              auVar92 = vfmadd132ps_fma(auVar188,auVar92,local_7a0._0_16_);
              auVar92 = vfmadd132ps_fma(_local_620,auVar92,local_760._0_16_);
              auVar189._0_4_ = auVar92._0_4_ * (float)local_640._0_4_;
              auVar189._4_4_ = auVar92._4_4_ * (float)local_640._0_4_;
              auVar189._8_4_ = auVar92._8_4_ * (float)local_640._0_4_;
              auVar189._12_4_ = auVar92._12_4_ * (float)local_640._0_4_;
              auVar92 = vdpps_avx(auVar86,auVar92,0x7f);
              fVar232 = auVar92._0_4_;
              auVar207._0_4_ = auVar86._0_4_ * fVar232;
              auVar207._4_4_ = auVar86._4_4_ * fVar232;
              auVar207._8_4_ = auVar86._8_4_ * fVar232;
              auVar207._12_4_ = auVar86._12_4_ * fVar232;
              auVar92 = vsubps_avx(auVar189,auVar207);
              fVar232 = (float)local_840._0_4_ * (float)local_660._0_4_;
              auVar91 = vmaxss_avx(ZEXT416((uint)fVar253),
                                   ZEXT416((uint)(local_740._0_4_ * (float)local_850._0_4_)));
              auVar208._0_4_ = auVar92._0_4_ * fVar232;
              auVar208._4_4_ = auVar92._4_4_ * fVar232;
              auVar208._8_4_ = auVar92._8_4_ * fVar232;
              auVar208._12_4_ = auVar92._12_4_ * fVar232;
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar96 = vxorps_avx512vl(auVar86,auVar24);
              auVar90 = vmulps_avx512vl(auVar90,auVar208);
              auVar92 = vdpps_avx(auVar96,auVar89,0x7f);
              auVar93 = vfmadd213ss_fma(auVar87,ZEXT416((uint)fVar253),auVar91);
              auVar87 = vdpps_avx(auVar85,auVar90,0x7f);
              auVar90 = vfmadd213ss_fma(ZEXT416((uint)fVar258),ZEXT416((uint)(fVar253 / fVar259)),
                                        auVar93);
              fVar258 = auVar92._0_4_ + auVar87._0_4_;
              auVar87 = vdpps_avx(local_7f0,auVar89,0x7f);
              auVar92 = vdpps_avx(auVar85,auVar96,0x7f);
              auVar93 = vmulss_avx512f(auVar95,auVar88);
              auVar94 = vaddss_avx512f(auVar94,ZEXT416((uint)(auVar93._0_4_ *
                                                             auVar88._0_4_ * auVar88._0_4_)));
              auVar93 = vdpps_avx(auVar85,local_7f0,0x7f);
              auVar89 = vfnmadd231ss_fma(auVar92,auVar97,ZEXT416((uint)fVar258));
              auVar93 = vfnmadd231ss_fma(auVar93,auVar97,auVar87);
              auVar92 = vpermilps_avx(local_600._0_16_,0xff);
              fVar231 = fVar231 - auVar92._0_4_;
              auVar88 = vshufps_avx(auVar86,auVar86,0xff);
              auVar92 = vfmsub213ss_fma(auVar89,auVar94,auVar88);
              auVar255._8_4_ = 0x80000000;
              auVar255._0_8_ = 0x8000000080000000;
              auVar255._12_4_ = 0x80000000;
              auVar257 = ZEXT1664(auVar255);
              auVar250._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
              auVar250._8_4_ = auVar92._8_4_ ^ 0x80000000;
              auVar250._12_4_ = auVar92._12_4_ ^ 0x80000000;
              auVar252 = ZEXT1664(auVar250);
              auVar93 = ZEXT416((uint)(auVar93._0_4_ * auVar94._0_4_));
              auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar87._0_4_ * auVar92._0_4_)),
                                        ZEXT416((uint)fVar258),auVar93);
              auVar92 = vinsertps_avx(auVar250,auVar93,0x1c);
              auVar245._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
              auVar245._8_4_ = auVar87._8_4_ ^ 0x80000000;
              auVar245._12_4_ = auVar87._12_4_ ^ 0x80000000;
              auVar93 = vinsertps_avx(ZEXT416((uint)fVar258),auVar245,0x10);
              auVar224._0_4_ = auVar89._0_4_;
              auVar224._4_4_ = auVar224._0_4_;
              auVar224._8_4_ = auVar224._0_4_;
              auVar224._12_4_ = auVar224._0_4_;
              auVar87 = vdivps_avx(auVar92,auVar224);
              auVar92 = vdivps_avx(auVar93,auVar224);
              auVar246 = ZEXT1664(CONCAT412(fVar231,CONCAT48(fVar231,CONCAT44(fVar231,fVar231))));
              auVar225._0_4_ = fVar260 * auVar87._0_4_ + fVar231 * auVar92._0_4_;
              auVar225._4_4_ = fVar260 * auVar87._4_4_ + fVar231 * auVar92._4_4_;
              auVar225._8_4_ = fVar260 * auVar87._8_4_ + fVar231 * auVar92._8_4_;
              auVar225._12_4_ = fVar260 * auVar87._12_4_ + fVar231 * auVar92._12_4_;
              auVar87 = vsubps_avx(auVar261,auVar225);
              auVar262 = ZEXT1664(auVar87);
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar92 = vandps_avx512vl(auVar97,auVar25);
              if (auVar92._0_4_ < auVar90._0_4_) {
                auVar92 = vfmadd231ss_fma(ZEXT416((uint)(auVar90._0_4_ + auVar91._0_4_)),local_6f0,
                                          ZEXT416(0x36000000));
                auVar26._8_4_ = 0x7fffffff;
                auVar26._0_8_ = 0x7fffffff7fffffff;
                auVar26._12_4_ = 0x7fffffff;
                auVar97 = vandps_avx512vl(ZEXT416((uint)fVar231),auVar26);
                if (auVar97._0_4_ < auVar92._0_4_) {
                  fVar258 = auVar87._0_4_ + (float)local_700._0_4_;
                  if ((fVar258 < fVar155) ||
                     (fVar259 = *(float *)(ray + k * 4 + 0x100), fVar259 < fVar258)) break;
                  auVar92 = vmovshdup_avx(auVar87);
                  fVar260 = auVar92._0_4_;
                  if ((fVar260 < 0.0) || (1.0 < fVar260)) break;
                  auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_820._0_4_));
                  fVar232 = auVar92._0_4_;
                  fVar231 = local_820._0_4_ * -0.5;
                  auVar246 = ZEXT464((uint)fVar231);
                  pGVar4 = (context->scene->geometries).items[uVar78].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                  fVar231 = fVar232 * 1.5 + fVar231 * fVar232 * fVar232 * fVar232;
                  auVar226._0_4_ = auVar85._0_4_ * fVar231;
                  auVar226._4_4_ = auVar85._4_4_ * fVar231;
                  auVar226._8_4_ = auVar85._8_4_ * fVar231;
                  auVar226._12_4_ = auVar85._12_4_ * fVar231;
                  auVar88 = vfmadd213ps_fma(auVar88,auVar226,auVar86);
                  auVar92 = vshufps_avx(auVar226,auVar226,0xc9);
                  auVar97 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar227._0_4_ = auVar226._0_4_ * auVar97._0_4_;
                  auVar227._4_4_ = auVar226._4_4_ * auVar97._4_4_;
                  auVar227._8_4_ = auVar226._8_4_ * auVar97._8_4_;
                  auVar227._12_4_ = auVar226._12_4_ * auVar97._12_4_;
                  auVar93 = vfmsub231ps_fma(auVar227,auVar86,auVar92);
                  auVar92 = vshufps_avx(auVar93,auVar93,0xc9);
                  auVar97 = vshufps_avx(auVar88,auVar88,0xc9);
                  auVar246 = ZEXT1664(auVar97);
                  auVar93 = vshufps_avx(auVar93,auVar93,0xd2);
                  auVar162._0_4_ = auVar88._0_4_ * auVar93._0_4_;
                  auVar162._4_4_ = auVar88._4_4_ * auVar93._4_4_;
                  auVar162._8_4_ = auVar88._8_4_ * auVar93._8_4_;
                  auVar162._12_4_ = auVar88._12_4_ * auVar93._12_4_;
                  auVar92 = vfmsub231ps_fma(auVar162,auVar92,auVar97);
                  uVar178 = auVar92._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar258;
                    uVar3 = vextractps_avx(auVar92,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar3;
                    uVar3 = vextractps_avx(auVar92,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar178;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar260;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(undefined4 *)(ray + k * 4 + 0x220) = uVar1;
                    *(uint *)(ray + k * 4 + 0x240) = uVar78;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar5 = context->user;
                  auVar230._8_4_ = 1;
                  auVar230._0_8_ = 0x100000001;
                  auVar230._12_4_ = 1;
                  auVar230._16_4_ = 1;
                  auVar230._20_4_ = 1;
                  auVar230._24_4_ = 1;
                  auVar230._28_4_ = 1;
                  local_440 = vpermps_avx2(auVar230,ZEXT1632(auVar87));
                  auVar109 = vpermps_avx2(auVar230,ZEXT1632(auVar92));
                  auVar240._8_4_ = 2;
                  auVar240._0_8_ = 0x200000002;
                  auVar240._12_4_ = 2;
                  auVar240._16_4_ = 2;
                  auVar240._20_4_ = 2;
                  auVar240._24_4_ = 2;
                  auVar240._28_4_ = 2;
                  local_480 = vpermps_avx2(auVar240,ZEXT1632(auVar92));
                  local_4a0[0] = (RTCHitN)auVar109[0];
                  local_4a0[1] = (RTCHitN)auVar109[1];
                  local_4a0[2] = (RTCHitN)auVar109[2];
                  local_4a0[3] = (RTCHitN)auVar109[3];
                  local_4a0[4] = (RTCHitN)auVar109[4];
                  local_4a0[5] = (RTCHitN)auVar109[5];
                  local_4a0[6] = (RTCHitN)auVar109[6];
                  local_4a0[7] = (RTCHitN)auVar109[7];
                  local_4a0[8] = (RTCHitN)auVar109[8];
                  local_4a0[9] = (RTCHitN)auVar109[9];
                  local_4a0[10] = (RTCHitN)auVar109[10];
                  local_4a0[0xb] = (RTCHitN)auVar109[0xb];
                  local_4a0[0xc] = (RTCHitN)auVar109[0xc];
                  local_4a0[0xd] = (RTCHitN)auVar109[0xd];
                  local_4a0[0xe] = (RTCHitN)auVar109[0xe];
                  local_4a0[0xf] = (RTCHitN)auVar109[0xf];
                  local_4a0[0x10] = (RTCHitN)auVar109[0x10];
                  local_4a0[0x11] = (RTCHitN)auVar109[0x11];
                  local_4a0[0x12] = (RTCHitN)auVar109[0x12];
                  local_4a0[0x13] = (RTCHitN)auVar109[0x13];
                  local_4a0[0x14] = (RTCHitN)auVar109[0x14];
                  local_4a0[0x15] = (RTCHitN)auVar109[0x15];
                  local_4a0[0x16] = (RTCHitN)auVar109[0x16];
                  local_4a0[0x17] = (RTCHitN)auVar109[0x17];
                  local_4a0[0x18] = (RTCHitN)auVar109[0x18];
                  local_4a0[0x19] = (RTCHitN)auVar109[0x19];
                  local_4a0[0x1a] = (RTCHitN)auVar109[0x1a];
                  local_4a0[0x1b] = (RTCHitN)auVar109[0x1b];
                  local_4a0[0x1c] = (RTCHitN)auVar109[0x1c];
                  local_4a0[0x1d] = (RTCHitN)auVar109[0x1d];
                  local_4a0[0x1e] = (RTCHitN)auVar109[0x1e];
                  local_4a0[0x1f] = (RTCHitN)auVar109[0x1f];
                  local_460 = uVar178;
                  uStack_45c = uVar178;
                  uStack_458 = uVar178;
                  uStack_454 = uVar178;
                  uStack_450 = uVar178;
                  uStack_44c = uVar178;
                  uStack_448 = uVar178;
                  uStack_444 = uVar178;
                  local_420 = ZEXT432(0) << 0x20;
                  local_400 = local_4e0._0_8_;
                  uStack_3f8 = local_4e0._8_8_;
                  uStack_3f0 = local_4e0._16_8_;
                  uStack_3e8 = local_4e0._24_8_;
                  local_3e0 = local_4c0;
                  auVar109 = vpcmpeqd_avx2(local_4c0,local_4c0);
                  local_828[1] = auVar109;
                  *local_828 = auVar109;
                  local_3c0 = pRVar5->instID[0];
                  uStack_3bc = local_3c0;
                  uStack_3b8 = local_3c0;
                  uStack_3b4 = local_3c0;
                  uStack_3b0 = local_3c0;
                  uStack_3ac = local_3c0;
                  uStack_3a8 = local_3c0;
                  uStack_3a4 = local_3c0;
                  local_3a0 = pRVar5->instPrimID[0];
                  uStack_39c = local_3a0;
                  uStack_398 = local_3a0;
                  uStack_394 = local_3a0;
                  uStack_390 = local_3a0;
                  uStack_38c = local_3a0;
                  uStack_388 = local_3a0;
                  uStack_384 = local_3a0;
                  *(float *)(ray + k * 4 + 0x100) = fVar258;
                  local_720 = local_520;
                  local_970.valid = (int *)local_720;
                  local_970.geometryUserPtr = pGVar4->userPtr;
                  local_970.context = context->user;
                  local_970.hit = local_4a0;
                  local_970.N = 8;
                  local_970.ray = (RTCRayN *)ray;
                  if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar246 = ZEXT1664(auVar97);
                    auVar252 = ZEXT1664(auVar250);
                    auVar257 = ZEXT1664(auVar255);
                    auVar262 = ZEXT1664(auVar87);
                    auVar264 = ZEXT1664(auVar85);
                    auVar266 = ZEXT1664(local_820._0_16_);
                    auVar269 = ZEXT1664(auVar86);
                    (*pGVar4->intersectionFilterN)(&local_970);
                    auVar274 = ZEXT3264(local_940);
                    auVar273 = ZEXT3264(local_920);
                    auVar272 = ZEXT3264(local_900);
                    auVar271 = ZEXT3264(local_8e0);
                  }
                  if (local_720 != (undefined1  [32])0x0) {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar246 = ZEXT1664(auVar246._0_16_);
                      auVar252 = ZEXT1664(auVar252._0_16_);
                      auVar257 = ZEXT1664(auVar257._0_16_);
                      auVar262 = ZEXT1664(auVar262._0_16_);
                      auVar264 = ZEXT1664(auVar264._0_16_);
                      auVar266 = ZEXT1664(auVar266._0_16_);
                      auVar269 = ZEXT1664(auVar269._0_16_);
                      (*p_Var6)(&local_970);
                      auVar274 = ZEXT3264(local_940);
                      auVar273 = ZEXT3264(local_920);
                      auVar272 = ZEXT3264(local_900);
                      auVar271 = ZEXT3264(local_8e0);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      uVar82 = vptestmd_avx512vl(local_720,local_720);
                      iVar59 = *(int *)(local_970.hit + 4);
                      iVar60 = *(int *)(local_970.hit + 8);
                      iVar61 = *(int *)(local_970.hit + 0xc);
                      iVar62 = *(int *)(local_970.hit + 0x10);
                      iVar63 = *(int *)(local_970.hit + 0x14);
                      iVar64 = *(int *)(local_970.hit + 0x18);
                      iVar65 = *(int *)(local_970.hit + 0x1c);
                      bVar80 = (byte)uVar82;
                      bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar13 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_970.ray + 0x180) =
                           (uint)(bVar80 & 1) * *(int *)local_970.hit |
                           (uint)!(bool)(bVar80 & 1) * *(int *)(local_970.ray + 0x180);
                      *(uint *)(local_970.ray + 0x184) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x184);
                      *(uint *)(local_970.ray + 0x188) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x188);
                      *(uint *)(local_970.ray + 0x18c) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x18c);
                      *(uint *)(local_970.ray + 400) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 400);
                      *(uint *)(local_970.ray + 0x194) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 0x194);
                      *(uint *)(local_970.ray + 0x198) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x198);
                      *(uint *)(local_970.ray + 0x19c) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x19c);
                      iVar59 = *(int *)(local_970.hit + 0x24);
                      iVar60 = *(int *)(local_970.hit + 0x28);
                      iVar61 = *(int *)(local_970.hit + 0x2c);
                      iVar62 = *(int *)(local_970.hit + 0x30);
                      iVar63 = *(int *)(local_970.hit + 0x34);
                      iVar64 = *(int *)(local_970.hit + 0x38);
                      iVar65 = *(int *)(local_970.hit + 0x3c);
                      bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar13 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_970.ray + 0x1a0) =
                           (uint)(bVar80 & 1) * *(int *)(local_970.hit + 0x20) |
                           (uint)!(bool)(bVar80 & 1) * *(int *)(local_970.ray + 0x1a0);
                      *(uint *)(local_970.ray + 0x1a4) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x1a4);
                      *(uint *)(local_970.ray + 0x1a8) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x1a8);
                      *(uint *)(local_970.ray + 0x1ac) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x1ac);
                      *(uint *)(local_970.ray + 0x1b0) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 0x1b0);
                      *(uint *)(local_970.ray + 0x1b4) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 0x1b4);
                      *(uint *)(local_970.ray + 0x1b8) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x1b8);
                      *(uint *)(local_970.ray + 0x1bc) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x1bc);
                      iVar59 = *(int *)(local_970.hit + 0x44);
                      iVar60 = *(int *)(local_970.hit + 0x48);
                      iVar61 = *(int *)(local_970.hit + 0x4c);
                      iVar62 = *(int *)(local_970.hit + 0x50);
                      iVar63 = *(int *)(local_970.hit + 0x54);
                      iVar64 = *(int *)(local_970.hit + 0x58);
                      iVar65 = *(int *)(local_970.hit + 0x5c);
                      bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar13 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_970.ray + 0x1c0) =
                           (uint)(bVar80 & 1) * *(int *)(local_970.hit + 0x40) |
                           (uint)!(bool)(bVar80 & 1) * *(int *)(local_970.ray + 0x1c0);
                      *(uint *)(local_970.ray + 0x1c4) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x1c4);
                      *(uint *)(local_970.ray + 0x1c8) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x1c8);
                      *(uint *)(local_970.ray + 0x1cc) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x1cc);
                      *(uint *)(local_970.ray + 0x1d0) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 0x1d0);
                      *(uint *)(local_970.ray + 0x1d4) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 0x1d4);
                      *(uint *)(local_970.ray + 0x1d8) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x1d8);
                      *(uint *)(local_970.ray + 0x1dc) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x1dc);
                      iVar59 = *(int *)(local_970.hit + 100);
                      iVar60 = *(int *)(local_970.hit + 0x68);
                      iVar61 = *(int *)(local_970.hit + 0x6c);
                      iVar62 = *(int *)(local_970.hit + 0x70);
                      iVar63 = *(int *)(local_970.hit + 0x74);
                      iVar64 = *(int *)(local_970.hit + 0x78);
                      iVar65 = *(int *)(local_970.hit + 0x7c);
                      bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar13 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_970.ray + 0x1e0) =
                           (uint)(bVar80 & 1) * *(int *)(local_970.hit + 0x60) |
                           (uint)!(bool)(bVar80 & 1) * *(int *)(local_970.ray + 0x1e0);
                      *(uint *)(local_970.ray + 0x1e4) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x1e4);
                      *(uint *)(local_970.ray + 0x1e8) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x1e8);
                      *(uint *)(local_970.ray + 0x1ec) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x1ec);
                      *(uint *)(local_970.ray + 0x1f0) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 0x1f0);
                      *(uint *)(local_970.ray + 500) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 500);
                      *(uint *)(local_970.ray + 0x1f8) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x1f8);
                      *(uint *)(local_970.ray + 0x1fc) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x1fc);
                      iVar59 = *(int *)(local_970.hit + 0x84);
                      iVar60 = *(int *)(local_970.hit + 0x88);
                      iVar61 = *(int *)(local_970.hit + 0x8c);
                      iVar62 = *(int *)(local_970.hit + 0x90);
                      iVar63 = *(int *)(local_970.hit + 0x94);
                      iVar64 = *(int *)(local_970.hit + 0x98);
                      iVar65 = *(int *)(local_970.hit + 0x9c);
                      bVar7 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar13 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_970.ray + 0x200) =
                           (uint)(bVar80 & 1) * *(int *)(local_970.hit + 0x80) |
                           (uint)!(bool)(bVar80 & 1) * *(int *)(local_970.ray + 0x200);
                      *(uint *)(local_970.ray + 0x204) =
                           (uint)bVar7 * iVar59 | (uint)!bVar7 * *(int *)(local_970.ray + 0x204);
                      *(uint *)(local_970.ray + 0x208) =
                           (uint)bVar8 * iVar60 | (uint)!bVar8 * *(int *)(local_970.ray + 0x208);
                      *(uint *)(local_970.ray + 0x20c) =
                           (uint)bVar9 * iVar61 | (uint)!bVar9 * *(int *)(local_970.ray + 0x20c);
                      *(uint *)(local_970.ray + 0x210) =
                           (uint)bVar10 * iVar62 | (uint)!bVar10 * *(int *)(local_970.ray + 0x210);
                      *(uint *)(local_970.ray + 0x214) =
                           (uint)bVar11 * iVar63 | (uint)!bVar11 * *(int *)(local_970.ray + 0x214);
                      *(uint *)(local_970.ray + 0x218) =
                           (uint)bVar12 * iVar64 | (uint)!bVar12 * *(int *)(local_970.ray + 0x218);
                      *(uint *)(local_970.ray + 0x21c) =
                           (uint)bVar13 * iVar65 | (uint)!bVar13 * *(int *)(local_970.ray + 0x21c);
                      auVar109 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_970.hit + 0xa0));
                      *(undefined1 (*) [32])(local_970.ray + 0x220) = auVar109;
                      auVar109 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_970.hit + 0xc0));
                      *(undefined1 (*) [32])(local_970.ray + 0x240) = auVar109;
                      auVar109 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_970.hit + 0xe0));
                      *(undefined1 (*) [32])(local_970.ray + 0x260) = auVar109;
                      auVar109 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_970.hit + 0x100));
                      *(undefined1 (*) [32])(local_970.ray + 0x280) = auVar109;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar259;
                  break;
                }
              }
              lVar81 = lVar81 + -1;
            } while (lVar81 != 0);
            uVar178 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar170._4_4_ = uVar178;
            auVar170._0_4_ = uVar178;
            auVar170._8_4_ = uVar178;
            auVar170._12_4_ = uVar178;
            auVar170._16_4_ = uVar178;
            auVar170._20_4_ = uVar178;
            auVar170._24_4_ = uVar178;
            auVar170._28_4_ = uVar178;
            auVar67._4_4_ = fStack_55c;
            auVar67._0_4_ = local_560;
            auVar67._8_4_ = fStack_558;
            auVar67._12_4_ = fStack_554;
            auVar67._16_4_ = fStack_550;
            auVar67._20_4_ = fStack_54c;
            auVar67._24_4_ = fStack_548;
            auVar67._28_4_ = fStack_544;
            uVar17 = vcmpps_avx512vl(auVar170,auVar67,0xd);
            bVar75 = ~('\x01' << ((byte)iVar20 & 0x1f)) & bVar75 & (byte)uVar17;
          } while (bVar75 != 0);
          auVar145 = local_580;
          fVar253 = (float)local_7e0._0_4_;
          fVar258 = (float)local_7e0._4_4_;
          fVar259 = fStack_7d8;
          fVar260 = fStack_7d4;
          fVar231 = fStack_7d0;
          fVar232 = fStack_7cc;
          fVar233 = fStack_7c8;
          fVar215 = fStack_7c4;
        }
        uVar18 = vpcmpgtd_avx512vl(auVar145,local_500);
        uVar19 = vpcmpd_avx512vl(local_500,local_320,1);
        auVar210._0_4_ = fVar253 + (float)local_200._0_4_;
        auVar210._4_4_ = fVar258 + (float)local_200._4_4_;
        auVar210._8_4_ = fVar259 + fStack_1f8;
        auVar210._12_4_ = fVar260 + fStack_1f4;
        auVar210._16_4_ = fVar231 + fStack_1f0;
        auVar210._20_4_ = fVar232 + fStack_1ec;
        auVar210._24_4_ = fVar233 + fStack_1e8;
        auVar210._28_4_ = fVar215 + fStack_1e4;
        uVar17 = vcmpps_avx512vl(auVar210,auVar170,2);
        bVar76 = bVar76 & (byte)uVar19 & (byte)uVar17;
        auVar211._0_4_ = fVar253 + local_380._0_4_;
        auVar211._4_4_ = fVar258 + local_380._4_4_;
        auVar211._8_4_ = fVar259 + local_380._8_4_;
        auVar211._12_4_ = fVar260 + local_380._12_4_;
        auVar211._16_4_ = fVar231 + local_380._16_4_;
        auVar211._20_4_ = fVar232 + local_380._20_4_;
        auVar211._24_4_ = fVar233 + local_380._24_4_;
        auVar211._28_4_ = fVar215 + local_380._28_4_;
        uVar17 = vcmpps_avx512vl(auVar211,auVar170,2);
        bVar70 = bVar70 & (byte)uVar18 & (byte)uVar17 | bVar76;
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar275 = ZEXT3264(auVar109);
        pPVar77 = local_698;
        prim = local_690;
        if (bVar70 != 0) {
          abStack_180[uVar73 * 0x60] = bVar70;
          auVar147._0_4_ =
               (uint)(bVar76 & 1) * local_200._0_4_ |
               (uint)!(bool)(bVar76 & 1) * (int)local_380._0_4_;
          bVar7 = (bool)(bVar76 >> 1 & 1);
          auVar147._4_4_ = (uint)bVar7 * local_200._4_4_ | (uint)!bVar7 * (int)local_380._4_4_;
          bVar7 = (bool)(bVar76 >> 2 & 1);
          auVar147._8_4_ = (uint)bVar7 * (int)fStack_1f8 | (uint)!bVar7 * (int)local_380._8_4_;
          bVar7 = (bool)(bVar76 >> 3 & 1);
          auVar147._12_4_ = (uint)bVar7 * (int)fStack_1f4 | (uint)!bVar7 * (int)local_380._12_4_;
          bVar7 = (bool)(bVar76 >> 4 & 1);
          auVar147._16_4_ = (uint)bVar7 * (int)fStack_1f0 | (uint)!bVar7 * (int)local_380._16_4_;
          bVar7 = (bool)(bVar76 >> 5 & 1);
          auVar147._20_4_ = (uint)bVar7 * (int)fStack_1ec | (uint)!bVar7 * (int)local_380._20_4_;
          auVar147._24_4_ =
               (uint)(bVar76 >> 6) * (int)fStack_1e8 |
               (uint)!(bool)(bVar76 >> 6) * (int)local_380._24_4_;
          auVar147._28_4_ = local_380._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar73 * 0x60) = auVar147;
          uVar82 = vmovlps_avx(local_530);
          (&uStack_140)[uVar73 * 0xc] = uVar82;
          aiStack_138[uVar73 * 0x18] = iVar79 + 1;
          uVar73 = (ulong)((int)uVar73 + 1);
        }
      }
    }
    do {
      uVar84 = (uint)uVar73;
      uVar73 = (ulong)(uVar84 - 1);
      if (uVar84 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar32._4_4_ = uVar1;
        auVar32._0_4_ = uVar1;
        auVar32._8_4_ = uVar1;
        auVar32._12_4_ = uVar1;
        auVar32._16_4_ = uVar1;
        auVar32._20_4_ = uVar1;
        auVar32._24_4_ = uVar1;
        auVar32._28_4_ = uVar1;
        uVar17 = vcmpps_avx512vl(local_300,auVar32,2);
        uVar78 = (uint)local_688 & (uint)uVar17;
        local_688 = (ulong)uVar78;
        if (uVar78 == 0) {
          return;
        }
        goto LAB_01ca98b7;
      }
      lVar81 = uVar73 * 0x60;
      auVar109 = *(undefined1 (*) [32])(auStack_160 + lVar81);
      auVar190._0_4_ = fVar253 + auVar109._0_4_;
      auVar190._4_4_ = fVar258 + auVar109._4_4_;
      auVar190._8_4_ = fVar259 + auVar109._8_4_;
      auVar190._12_4_ = fVar260 + auVar109._12_4_;
      auVar190._16_4_ = fVar231 + auVar109._16_4_;
      auVar190._20_4_ = fVar232 + auVar109._20_4_;
      auVar190._24_4_ = fVar233 + auVar109._24_4_;
      auVar190._28_4_ = fVar215 + auVar109._28_4_;
      uVar178 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar31._4_4_ = uVar178;
      auVar31._0_4_ = uVar178;
      auVar31._8_4_ = uVar178;
      auVar31._12_4_ = uVar178;
      auVar31._16_4_ = uVar178;
      auVar31._20_4_ = uVar178;
      auVar31._24_4_ = uVar178;
      auVar31._28_4_ = uVar178;
      uVar17 = vcmpps_avx512vl(auVar190,auVar31,2);
      uVar83 = (uint)uVar17 & (uint)abStack_180[lVar81];
    } while (uVar83 == 0);
    uVar82 = (&uStack_140)[uVar73 * 0xc];
    auVar179._8_8_ = 0;
    auVar179._0_8_ = uVar82;
    auVar209._8_4_ = 0x7f800000;
    auVar209._0_8_ = 0x7f8000007f800000;
    auVar209._12_4_ = 0x7f800000;
    auVar209._16_4_ = 0x7f800000;
    auVar209._20_4_ = 0x7f800000;
    auVar209._24_4_ = 0x7f800000;
    auVar209._28_4_ = 0x7f800000;
    auVar110 = vblendmps_avx512vl(auVar209,auVar109);
    bVar70 = (byte)uVar83;
    auVar143._0_4_ =
         (uint)(bVar70 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar70 & 1) * (int)auVar109._0_4_;
    bVar7 = (bool)((byte)(uVar83 >> 1) & 1);
    auVar143._4_4_ = (uint)bVar7 * auVar110._4_4_ | (uint)!bVar7 * (int)auVar109._4_4_;
    bVar7 = (bool)((byte)(uVar83 >> 2) & 1);
    auVar143._8_4_ = (uint)bVar7 * auVar110._8_4_ | (uint)!bVar7 * (int)auVar109._8_4_;
    bVar7 = (bool)((byte)(uVar83 >> 3) & 1);
    auVar143._12_4_ = (uint)bVar7 * auVar110._12_4_ | (uint)!bVar7 * (int)auVar109._12_4_;
    bVar7 = (bool)((byte)(uVar83 >> 4) & 1);
    auVar143._16_4_ = (uint)bVar7 * auVar110._16_4_ | (uint)!bVar7 * (int)auVar109._16_4_;
    bVar7 = (bool)((byte)(uVar83 >> 5) & 1);
    auVar143._20_4_ = (uint)bVar7 * auVar110._20_4_ | (uint)!bVar7 * (int)auVar109._20_4_;
    bVar7 = (bool)((byte)(uVar83 >> 6) & 1);
    auVar143._24_4_ = (uint)bVar7 * auVar110._24_4_ | (uint)!bVar7 * (int)auVar109._24_4_;
    auVar143._28_4_ =
         (uVar83 >> 7) * auVar110._28_4_ | (uint)!SUB41(uVar83 >> 7,0) * (int)auVar109._28_4_;
    auVar109 = vshufps_avx(auVar143,auVar143,0xb1);
    auVar109 = vminps_avx(auVar143,auVar109);
    auVar110 = vshufpd_avx(auVar109,auVar109,5);
    auVar109 = vminps_avx(auVar109,auVar110);
    auVar110 = vpermpd_avx2(auVar109,0x4e);
    auVar109 = vminps_avx(auVar109,auVar110);
    uVar17 = vcmpps_avx512vl(auVar143,auVar109,0);
    bVar75 = (byte)uVar17 & bVar70;
    if (bVar75 != 0) {
      uVar83 = (uint)bVar75;
    }
    uVar148 = 0;
    for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
      uVar148 = uVar148 + 1;
    }
    iVar79 = aiStack_138[uVar73 * 0x18];
    bVar70 = ~('\x01' << ((byte)uVar148 & 0x1f)) & bVar70;
    abStack_180[lVar81] = bVar70;
    if (bVar70 == 0) {
      uVar84 = uVar84 - 1;
    }
    uVar178 = (undefined4)uVar82;
    auVar166._4_4_ = uVar178;
    auVar166._0_4_ = uVar178;
    auVar166._8_4_ = uVar178;
    auVar166._12_4_ = uVar178;
    auVar166._16_4_ = uVar178;
    auVar166._20_4_ = uVar178;
    auVar166._24_4_ = uVar178;
    auVar166._28_4_ = uVar178;
    auVar87 = vmovshdup_avx(auVar179);
    auVar87 = vsubps_avx(auVar87,auVar179);
    auVar191._0_4_ = auVar87._0_4_;
    auVar191._4_4_ = auVar191._0_4_;
    auVar191._8_4_ = auVar191._0_4_;
    auVar191._12_4_ = auVar191._0_4_;
    auVar191._16_4_ = auVar191._0_4_;
    auVar191._20_4_ = auVar191._0_4_;
    auVar191._24_4_ = auVar191._0_4_;
    auVar191._28_4_ = auVar191._0_4_;
    auVar87 = vfmadd132ps_fma(auVar191,auVar166,_DAT_01faff20);
    auVar109 = ZEXT1632(auVar87);
    local_4a0[0] = (RTCHitN)auVar109[0];
    local_4a0[1] = (RTCHitN)auVar109[1];
    local_4a0[2] = (RTCHitN)auVar109[2];
    local_4a0[3] = (RTCHitN)auVar109[3];
    local_4a0[4] = (RTCHitN)auVar109[4];
    local_4a0[5] = (RTCHitN)auVar109[5];
    local_4a0[6] = (RTCHitN)auVar109[6];
    local_4a0[7] = (RTCHitN)auVar109[7];
    local_4a0[8] = (RTCHitN)auVar109[8];
    local_4a0[9] = (RTCHitN)auVar109[9];
    local_4a0[10] = (RTCHitN)auVar109[10];
    local_4a0[0xb] = (RTCHitN)auVar109[0xb];
    local_4a0[0xc] = (RTCHitN)auVar109[0xc];
    local_4a0[0xd] = (RTCHitN)auVar109[0xd];
    local_4a0[0xe] = (RTCHitN)auVar109[0xe];
    local_4a0[0xf] = (RTCHitN)auVar109[0xf];
    local_4a0[0x10] = (RTCHitN)auVar109[0x10];
    local_4a0[0x11] = (RTCHitN)auVar109[0x11];
    local_4a0[0x12] = (RTCHitN)auVar109[0x12];
    local_4a0[0x13] = (RTCHitN)auVar109[0x13];
    local_4a0[0x14] = (RTCHitN)auVar109[0x14];
    local_4a0[0x15] = (RTCHitN)auVar109[0x15];
    local_4a0[0x16] = (RTCHitN)auVar109[0x16];
    local_4a0[0x17] = (RTCHitN)auVar109[0x17];
    local_4a0[0x18] = (RTCHitN)auVar109[0x18];
    local_4a0[0x19] = (RTCHitN)auVar109[0x19];
    local_4a0[0x1a] = (RTCHitN)auVar109[0x1a];
    local_4a0[0x1b] = (RTCHitN)auVar109[0x1b];
    local_4a0[0x1c] = (RTCHitN)auVar109[0x1c];
    local_4a0[0x1d] = (RTCHitN)auVar109[0x1d];
    local_4a0[0x1e] = (RTCHitN)auVar109[0x1e];
    local_4a0[0x1f] = (RTCHitN)auVar109[0x1f];
    local_530._8_8_ = 0;
    local_530._0_8_ = *(ulong *)(local_4a0 + (ulong)uVar148 * 4);
    uVar73 = (ulong)uVar84;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }